

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::sse2::CurveNvIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  Primitive *pPVar2;
  Primitive *pPVar3;
  Primitive *pPVar4;
  Primitive PVar5;
  Geometry *pGVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined6 uVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  int iVar41;
  undefined4 uVar42;
  undefined4 uVar47;
  undefined8 uVar43;
  RayK<4> *pRVar44;
  RTCFilterFunctionN p_Var45;
  undefined1 (*pauVar46) [16];
  ulong uVar48;
  long lVar49;
  ulong uVar50;
  int iVar51;
  bool bVar52;
  int iVar53;
  Primitive *pPVar54;
  ulong uVar55;
  bool bVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  short sVar61;
  float fVar62;
  float fVar63;
  float fVar105;
  float fVar107;
  __m128 a_1;
  undefined2 uVar104;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  float fVar106;
  float fVar108;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float pp;
  float fVar109;
  float fVar135;
  float fVar136;
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar137;
  float fVar150;
  float fVar151;
  vfloat4 a;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar152;
  float fVar172;
  float fVar173;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar174;
  float fVar185;
  float fVar186;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  float fVar187;
  float fVar198;
  float fVar199;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  float fVar200;
  float fVar210;
  float fVar211;
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar212;
  float fVar229;
  float fVar230;
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar231;
  float fVar238;
  float fVar239;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar240;
  float fVar242;
  float fVar243;
  undefined1 auVar241 [16];
  float fVar244;
  float fVar253;
  float fVar254;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar255;
  float fVar263;
  float fVar265;
  undefined1 auVar256 [16];
  float fVar267;
  undefined1 auVar259 [16];
  float fVar264;
  float fVar266;
  float fVar268;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar269;
  float fVar270;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar271 [16];
  float fVar277;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar286 [16];
  float s;
  float fVar287;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar288 [16];
  Vec3fa dir;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined8 local_5c8;
  undefined1 local_598 [16];
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  undefined1 local_568 [4];
  float fStack_564;
  undefined8 uStack_560;
  RTCRayQueryContext *local_558;
  RayK<4> *local_550;
  RTCHitN *local_548;
  uint local_540;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined1 local_508 [8];
  float fStack_500;
  undefined4 uStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [16];
  undefined1 (*local_4a0) [16];
  Primitive *local_498;
  Primitive *local_490;
  ulong local_488;
  ulong local_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  uint local_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined4 local_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  uint local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  uint local_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  float local_108 [4];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 uVar103;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar196 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar209 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  
  PVar5 = prim[1];
  uVar55 = (ulong)(byte)PVar5;
  pPVar54 = prim + uVar55 * 0x19 + 6;
  fVar151 = *(float *)(pPVar54 + 0xc);
  fVar174 = (*(float *)(ray + k * 4) - *(float *)pPVar54) * fVar151;
  fVar185 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar54 + 4)) * fVar151;
  fVar186 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar54 + 8)) * fVar151;
  fVar137 = *(float *)(ray + k * 4 + 0x40) * fVar151;
  fVar150 = *(float *)(ray + k * 4 + 0x50) * fVar151;
  fVar151 = *(float *)(ray + k * 4 + 0x60) * fVar151;
  uVar47 = *(undefined4 *)(prim + uVar55 * 4 + 6);
  uVar103 = (undefined1)((uint)uVar47 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar47 >> 0x10);
  uVar43 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar47));
  uVar103 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar43 >> 0x20),uVar103),uVar103);
  sVar61 = CONCAT11((char)uVar47,(char)uVar47);
  uVar50 = CONCAT62(uVar25,sVar61);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar50;
  auVar71._12_2_ = uVar104;
  auVar71._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar43 >> 0x20);
  auVar190._12_4_ = auVar71._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar50;
  auVar190._10_2_ = uVar104;
  auVar191._10_6_ = auVar190._10_6_;
  auVar191._8_2_ = uVar104;
  auVar191._0_8_ = uVar50;
  uVar104 = (undefined2)uVar25;
  auVar26._4_8_ = auVar191._8_8_;
  auVar26._2_2_ = uVar104;
  auVar26._0_2_ = uVar104;
  fVar109 = (float)((int)sVar61 >> 8);
  fVar135 = (float)(auVar26._0_4_ >> 0x18);
  fVar136 = (float)(auVar191._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar55 * 5 + 6);
  uVar103 = (undefined1)((uint)uVar47 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar47 >> 0x10);
  uVar43 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar47));
  uVar103 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar43 >> 0x20),uVar103),uVar103);
  sVar61 = CONCAT11((char)uVar47,(char)uVar47);
  uVar50 = CONCAT62(uVar25,sVar61);
  auVar234._8_4_ = 0;
  auVar234._0_8_ = uVar50;
  auVar234._12_2_ = uVar104;
  auVar234._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar43 >> 0x20);
  auVar246._12_4_ = auVar234._12_4_;
  auVar246._8_2_ = 0;
  auVar246._0_8_ = uVar50;
  auVar246._10_2_ = uVar104;
  auVar64._10_6_ = auVar246._10_6_;
  auVar64._8_2_ = uVar104;
  auVar64._0_8_ = uVar50;
  uVar104 = (undefined2)uVar25;
  auVar27._4_8_ = auVar64._8_8_;
  auVar27._2_2_ = uVar104;
  auVar27._0_2_ = uVar104;
  fVar187 = (float)((int)sVar61 >> 8);
  fVar198 = (float)(auVar27._0_4_ >> 0x18);
  fVar199 = (float)(auVar64._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar55 * 6 + 6);
  uVar103 = (undefined1)((uint)uVar47 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar47 >> 0x10);
  uVar43 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar47));
  uVar103 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar43 >> 0x20),uVar103),uVar103);
  sVar61 = CONCAT11((char)uVar47,(char)uVar47);
  uVar50 = CONCAT62(uVar25,sVar61);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar50;
  auVar67._12_2_ = uVar104;
  auVar67._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar43 >> 0x20);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar50;
  auVar66._10_2_ = uVar104;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = uVar104;
  auVar65._0_8_ = uVar50;
  uVar104 = (undefined2)uVar25;
  auVar28._4_8_ = auVar65._8_8_;
  auVar28._2_2_ = uVar104;
  auVar28._0_2_ = uVar104;
  fVar152 = (float)((int)sVar61 >> 8);
  fVar172 = (float)(auVar28._0_4_ >> 0x18);
  fVar173 = (float)(auVar65._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar55 * 0xb + 6);
  uVar103 = (undefined1)((uint)uVar47 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar47 >> 0x10);
  uVar43 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar47));
  uVar103 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar43 >> 0x20),uVar103),uVar103);
  sVar61 = CONCAT11((char)uVar47,(char)uVar47);
  uVar50 = CONCAT62(uVar25,sVar61);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar50;
  auVar70._12_2_ = uVar104;
  auVar70._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar43 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar50;
  auVar69._10_2_ = uVar104;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar104;
  auVar68._0_8_ = uVar50;
  uVar104 = (undefined2)uVar25;
  auVar29._4_8_ = auVar68._8_8_;
  auVar29._2_2_ = uVar104;
  auVar29._0_2_ = uVar104;
  fVar62 = (float)((int)sVar61 >> 8);
  fVar105 = (float)(auVar29._0_4_ >> 0x18);
  fVar107 = (float)(auVar68._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar103 = (undefined1)((uint)uVar47 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar47 >> 0x10);
  uVar43 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar47));
  uVar103 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar43 >> 0x20),uVar103),uVar103);
  sVar61 = CONCAT11((char)uVar47,(char)uVar47);
  uVar50 = CONCAT62(uVar25,sVar61);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar50;
  auVar203._12_2_ = uVar104;
  auVar203._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar43 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar50;
  auVar202._10_2_ = uVar104;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar104;
  auVar201._0_8_ = uVar50;
  uVar104 = (undefined2)uVar25;
  auVar30._4_8_ = auVar201._8_8_;
  auVar30._2_2_ = uVar104;
  auVar30._0_2_ = uVar104;
  fVar200 = (float)((int)sVar61 >> 8);
  fVar210 = (float)(auVar30._0_4_ >> 0x18);
  fVar211 = (float)(auVar201._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar55 + 6);
  uVar103 = (undefined1)((uint)uVar47 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar47 >> 0x10);
  uVar43 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar47));
  uVar103 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar43 >> 0x20),uVar103),uVar103);
  sVar61 = CONCAT11((char)uVar47,(char)uVar47);
  uVar50 = CONCAT62(uVar25,sVar61);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar50;
  auVar215._12_2_ = uVar104;
  auVar215._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar43 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar50;
  auVar214._10_2_ = uVar104;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar104;
  auVar213._0_8_ = uVar50;
  uVar104 = (undefined2)uVar25;
  auVar31._4_8_ = auVar213._8_8_;
  auVar31._2_2_ = uVar104;
  auVar31._0_2_ = uVar104;
  fVar240 = (float)((int)sVar61 >> 8);
  fVar242 = (float)(auVar31._0_4_ >> 0x18);
  fVar243 = (float)(auVar213._8_4_ >> 0x18);
  uVar48 = (ulong)(uint)((int)(uVar55 * 9) * 2);
  uVar47 = *(undefined4 *)(prim + uVar48 + 6);
  uVar103 = (undefined1)((uint)uVar47 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar47 >> 0x10);
  uVar43 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar47));
  uVar103 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar43 >> 0x20),uVar103),uVar103);
  sVar61 = CONCAT11((char)uVar47,(char)uVar47);
  uVar50 = CONCAT62(uVar25,sVar61);
  auVar218._8_4_ = 0;
  auVar218._0_8_ = uVar50;
  auVar218._12_2_ = uVar104;
  auVar218._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar43 >> 0x20);
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._8_2_ = 0;
  auVar217._0_8_ = uVar50;
  auVar217._10_2_ = uVar104;
  auVar216._10_6_ = auVar217._10_6_;
  auVar216._8_2_ = uVar104;
  auVar216._0_8_ = uVar50;
  uVar104 = (undefined2)uVar25;
  auVar32._4_8_ = auVar216._8_8_;
  auVar32._2_2_ = uVar104;
  auVar32._0_2_ = uVar104;
  fVar231 = (float)((int)sVar61 >> 8);
  fVar238 = (float)(auVar32._0_4_ >> 0x18);
  fVar239 = (float)(auVar216._8_4_ >> 0x18);
  uVar47 = *(undefined4 *)(prim + uVar48 + uVar55 + 6);
  uVar103 = (undefined1)((uint)uVar47 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar47 >> 0x10);
  uVar43 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar47));
  uVar103 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar43 >> 0x20),uVar103),uVar103);
  sVar61 = CONCAT11((char)uVar47,(char)uVar47);
  uVar50 = CONCAT62(uVar25,sVar61);
  auVar221._8_4_ = 0;
  auVar221._0_8_ = uVar50;
  auVar221._12_2_ = uVar104;
  auVar221._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar43 >> 0x20);
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._8_2_ = 0;
  auVar220._0_8_ = uVar50;
  auVar220._10_2_ = uVar104;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._8_2_ = uVar104;
  auVar219._0_8_ = uVar50;
  uVar104 = (undefined2)uVar25;
  auVar33._4_8_ = auVar219._8_8_;
  auVar33._2_2_ = uVar104;
  auVar33._0_2_ = uVar104;
  fVar244 = (float)((int)sVar61 >> 8);
  fVar253 = (float)(auVar33._0_4_ >> 0x18);
  fVar254 = (float)(auVar219._8_4_ >> 0x18);
  uVar48 = (ulong)(uint)((int)(uVar55 * 5) << 2);
  uVar47 = *(undefined4 *)(prim + uVar48 + 6);
  uVar103 = (undefined1)((uint)uVar47 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar47 >> 0x10);
  uVar43 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar47));
  uVar103 = (undefined1)((uint)uVar47 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar43 >> 0x20),uVar103),uVar103);
  sVar61 = CONCAT11((char)uVar47,(char)uVar47);
  uVar50 = CONCAT62(uVar25,sVar61);
  auVar258._8_4_ = 0;
  auVar258._0_8_ = uVar50;
  auVar258._12_2_ = uVar104;
  auVar258._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar43 >> 0x20);
  auVar257._12_4_ = auVar258._12_4_;
  auVar257._8_2_ = 0;
  auVar257._0_8_ = uVar50;
  auVar257._10_2_ = uVar104;
  auVar256._10_6_ = auVar257._10_6_;
  auVar256._8_2_ = uVar104;
  auVar256._0_8_ = uVar50;
  uVar104 = (undefined2)uVar25;
  auVar34._4_8_ = auVar256._8_8_;
  auVar34._2_2_ = uVar104;
  auVar34._0_2_ = uVar104;
  fVar63 = (float)((int)sVar61 >> 8);
  fVar106 = (float)(auVar34._0_4_ >> 0x18);
  fVar108 = (float)(auVar256._8_4_ >> 0x18);
  fVar269 = fVar137 * fVar109 + fVar150 * fVar187 + fVar151 * fVar152;
  fVar272 = fVar137 * fVar135 + fVar150 * fVar198 + fVar151 * fVar172;
  fVar274 = fVar137 * fVar136 + fVar150 * fVar199 + fVar151 * fVar173;
  fVar276 = fVar137 * (float)(auVar190._12_4_ >> 0x18) +
            fVar150 * (float)(auVar246._12_4_ >> 0x18) + fVar151 * (float)(auVar66._12_4_ >> 0x18);
  fVar255 = fVar137 * fVar62 + fVar150 * fVar200 + fVar151 * fVar240;
  fVar263 = fVar137 * fVar105 + fVar150 * fVar210 + fVar151 * fVar242;
  fVar265 = fVar137 * fVar107 + fVar150 * fVar211 + fVar151 * fVar243;
  fVar267 = fVar137 * (float)(auVar69._12_4_ >> 0x18) +
            fVar150 * (float)(auVar202._12_4_ >> 0x18) + fVar151 * (float)(auVar214._12_4_ >> 0x18);
  fVar212 = fVar137 * fVar231 + fVar150 * fVar244 + fVar151 * fVar63;
  fVar229 = fVar137 * fVar238 + fVar150 * fVar253 + fVar151 * fVar106;
  fVar230 = fVar137 * fVar239 + fVar150 * fVar254 + fVar151 * fVar108;
  fVar137 = fVar137 * (float)(auVar217._12_4_ >> 0x18) +
            fVar150 * (float)(auVar220._12_4_ >> 0x18) + fVar151 * (float)(auVar257._12_4_ >> 0x18);
  uVar47 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar152 = fVar109 * fVar174 + fVar187 * fVar185 + fVar152 * fVar186;
  fVar172 = fVar135 * fVar174 + fVar198 * fVar185 + fVar172 * fVar186;
  fVar173 = fVar136 * fVar174 + fVar199 * fVar185 + fVar173 * fVar186;
  fVar187 = (float)(auVar190._12_4_ >> 0x18) * fVar174 +
            (float)(auVar246._12_4_ >> 0x18) * fVar185 + (float)(auVar66._12_4_ >> 0x18) * fVar186;
  fVar240 = fVar62 * fVar174 + fVar200 * fVar185 + fVar240 * fVar186;
  fVar210 = fVar105 * fVar174 + fVar210 * fVar185 + fVar242 * fVar186;
  fVar211 = fVar107 * fVar174 + fVar211 * fVar185 + fVar243 * fVar186;
  fVar242 = (float)(auVar69._12_4_ >> 0x18) * fVar174 +
            (float)(auVar202._12_4_ >> 0x18) * fVar185 + (float)(auVar214._12_4_ >> 0x18) * fVar186;
  fVar198 = fVar174 * fVar231 + fVar185 * fVar244 + fVar186 * fVar63;
  fVar199 = fVar174 * fVar238 + fVar185 * fVar253 + fVar186 * fVar106;
  fVar200 = fVar174 * fVar239 + fVar185 * fVar254 + fVar186 * fVar108;
  fVar174 = fVar174 * (float)(auVar217._12_4_ >> 0x18) +
            fVar185 * (float)(auVar220._12_4_ >> 0x18) + fVar186 * (float)(auVar257._12_4_ >> 0x18);
  fVar151 = (float)DAT_01f80d30;
  fVar62 = DAT_01f80d30._4_4_;
  fVar63 = DAT_01f80d30._8_4_;
  fVar105 = DAT_01f80d30._12_4_;
  uVar57 = -(uint)(fVar151 <= ABS(fVar269));
  uVar58 = -(uint)(fVar62 <= ABS(fVar272));
  uVar59 = -(uint)(fVar63 <= ABS(fVar274));
  uVar60 = -(uint)(fVar105 <= ABS(fVar276));
  auVar271._0_4_ = (uint)fVar269 & uVar57;
  auVar271._4_4_ = (uint)fVar272 & uVar58;
  auVar271._8_4_ = (uint)fVar274 & uVar59;
  auVar271._12_4_ = (uint)fVar276 & uVar60;
  auVar175._0_4_ = ~uVar57 & (uint)fVar151;
  auVar175._4_4_ = ~uVar58 & (uint)fVar62;
  auVar175._8_4_ = ~uVar59 & (uint)fVar63;
  auVar175._12_4_ = ~uVar60 & (uint)fVar105;
  auVar175 = auVar175 | auVar271;
  uVar57 = -(uint)(fVar151 <= ABS(fVar255));
  uVar58 = -(uint)(fVar62 <= ABS(fVar263));
  uVar59 = -(uint)(fVar63 <= ABS(fVar265));
  uVar60 = -(uint)(fVar105 <= ABS(fVar267));
  auVar259._0_4_ = (uint)fVar255 & uVar57;
  auVar259._4_4_ = (uint)fVar263 & uVar58;
  auVar259._8_4_ = (uint)fVar265 & uVar59;
  auVar259._12_4_ = (uint)fVar267 & uVar60;
  auVar188._0_4_ = ~uVar57 & (uint)fVar151;
  auVar188._4_4_ = ~uVar58 & (uint)fVar62;
  auVar188._8_4_ = ~uVar59 & (uint)fVar63;
  auVar188._12_4_ = ~uVar60 & (uint)fVar105;
  auVar188 = auVar188 | auVar259;
  uVar57 = -(uint)(fVar151 <= ABS(fVar212));
  uVar58 = -(uint)(fVar62 <= ABS(fVar229));
  uVar59 = -(uint)(fVar63 <= ABS(fVar230));
  uVar60 = -(uint)(fVar105 <= ABS(fVar137));
  auVar222._0_4_ = (uint)fVar212 & uVar57;
  auVar222._4_4_ = (uint)fVar229 & uVar58;
  auVar222._8_4_ = (uint)fVar230 & uVar59;
  auVar222._12_4_ = (uint)fVar137 & uVar60;
  auVar204._0_4_ = ~uVar57 & (uint)fVar151;
  auVar204._4_4_ = ~uVar58 & (uint)fVar62;
  auVar204._8_4_ = ~uVar59 & (uint)fVar63;
  auVar204._12_4_ = ~uVar60 & (uint)fVar105;
  auVar204 = auVar204 | auVar222;
  auVar71 = rcpps(_DAT_01f80d30,auVar175);
  fVar151 = auVar71._0_4_;
  fVar105 = auVar71._4_4_;
  fVar108 = auVar71._8_4_;
  fVar136 = auVar71._12_4_;
  fVar151 = (1.0 - auVar175._0_4_ * fVar151) * fVar151 + fVar151;
  fVar105 = (1.0 - auVar175._4_4_ * fVar105) * fVar105 + fVar105;
  fVar108 = (1.0 - auVar175._8_4_ * fVar108) * fVar108 + fVar108;
  fVar136 = (1.0 - auVar175._12_4_ * fVar136) * fVar136 + fVar136;
  auVar71 = rcpps(auVar71,auVar188);
  fVar62 = auVar71._0_4_;
  fVar106 = auVar71._4_4_;
  fVar109 = auVar71._8_4_;
  fVar137 = auVar71._12_4_;
  fVar62 = (1.0 - auVar188._0_4_ * fVar62) * fVar62 + fVar62;
  fVar106 = (1.0 - auVar188._4_4_ * fVar106) * fVar106 + fVar106;
  fVar109 = (1.0 - auVar188._8_4_ * fVar109) * fVar109 + fVar109;
  fVar137 = (1.0 - auVar188._12_4_ * fVar137) * fVar137 + fVar137;
  auVar71 = rcpps(auVar71,auVar204);
  fVar63 = auVar71._0_4_;
  fVar107 = auVar71._4_4_;
  fVar135 = auVar71._8_4_;
  fVar150 = auVar71._12_4_;
  fVar63 = (1.0 - auVar204._0_4_ * fVar63) * fVar63 + fVar63;
  fVar107 = (1.0 - auVar204._4_4_ * fVar107) * fVar107 + fVar107;
  fVar135 = (1.0 - auVar204._8_4_ * fVar135) * fVar135 + fVar135;
  fVar150 = (1.0 - auVar204._12_4_ * fVar150) * fVar150 + fVar150;
  uVar50 = *(ulong *)(prim + uVar55 * 7 + 6);
  uVar104 = (undefined2)(uVar50 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar50;
  auVar74._12_2_ = uVar104;
  auVar74._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar50 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar50;
  auVar73._10_2_ = uVar104;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar104;
  auVar72._0_8_ = uVar50;
  uVar104 = (undefined2)(uVar50 >> 0x10);
  auVar35._4_8_ = auVar72._8_8_;
  auVar35._2_2_ = uVar104;
  auVar35._0_2_ = uVar104;
  auVar176._0_8_ =
       CONCAT44(((float)(auVar35._0_4_ >> 0x10) - fVar172) * fVar105,
                ((float)(int)(short)uVar50 - fVar152) * fVar151);
  auVar176._8_4_ = ((float)(auVar72._8_4_ >> 0x10) - fVar173) * fVar108;
  auVar176._12_4_ = ((float)(auVar73._12_4_ >> 0x10) - fVar187) * fVar136;
  uVar50 = *(ulong *)(prim + uVar55 * 9 + 6);
  uVar104 = (undefined2)(uVar50 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar50;
  auVar77._12_2_ = uVar104;
  auVar77._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar50 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar50;
  auVar76._10_2_ = uVar104;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar104;
  auVar75._0_8_ = uVar50;
  uVar104 = (undefined2)(uVar50 >> 0x10);
  auVar36._4_8_ = auVar75._8_8_;
  auVar36._2_2_ = uVar104;
  auVar36._0_2_ = uVar104;
  auVar205._0_4_ = ((float)(int)(short)uVar50 - fVar152) * fVar151;
  auVar205._4_4_ = ((float)(auVar36._0_4_ >> 0x10) - fVar172) * fVar105;
  auVar205._8_4_ = ((float)(auVar75._8_4_ >> 0x10) - fVar173) * fVar108;
  auVar205._12_4_ = ((float)(auVar76._12_4_ >> 0x10) - fVar187) * fVar136;
  lVar49 = uVar48 + uVar55;
  uVar50 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar48 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar55 * -2 + 6);
  uVar104 = (undefined2)(uVar48 >> 0x30);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar48;
  auVar112._12_2_ = uVar104;
  auVar112._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar48 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar48;
  auVar111._10_2_ = uVar104;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar104;
  auVar110._0_8_ = uVar48;
  uVar104 = (undefined2)(uVar48 >> 0x10);
  auVar37._4_8_ = auVar110._8_8_;
  auVar37._2_2_ = uVar104;
  auVar37._0_2_ = uVar104;
  auVar113._0_8_ =
       CONCAT44(((float)(auVar37._0_4_ >> 0x10) - fVar210) * fVar106,
                ((float)(int)(short)uVar48 - fVar240) * fVar62);
  auVar113._8_4_ = ((float)(auVar110._8_4_ >> 0x10) - fVar211) * fVar109;
  auVar113._12_4_ = ((float)(auVar111._12_4_ >> 0x10) - fVar242) * fVar137;
  uVar104 = (undefined2)(uVar50 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar50;
  auVar80._12_2_ = uVar104;
  auVar80._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar50 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar50;
  auVar79._10_2_ = uVar104;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar104;
  auVar78._0_8_ = uVar50;
  uVar104 = (undefined2)(uVar50 >> 0x10);
  auVar38._4_8_ = auVar78._8_8_;
  auVar38._2_2_ = uVar104;
  auVar38._0_2_ = uVar104;
  auVar232._0_4_ = ((float)(int)(short)uVar50 - fVar240) * fVar62;
  auVar232._4_4_ = ((float)(auVar38._0_4_ >> 0x10) - fVar210) * fVar106;
  auVar232._8_4_ = ((float)(auVar78._8_4_ >> 0x10) - fVar211) * fVar109;
  auVar232._12_4_ = ((float)(auVar79._12_4_ >> 0x10) - fVar242) * fVar137;
  uVar50 = *(ulong *)(prim + lVar49 + 6);
  uVar104 = (undefined2)(uVar50 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar50;
  auVar83._12_2_ = uVar104;
  auVar83._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar50 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar50;
  auVar82._10_2_ = uVar104;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar104;
  auVar81._0_8_ = uVar50;
  uVar104 = (undefined2)(uVar50 >> 0x10);
  auVar39._4_8_ = auVar81._8_8_;
  auVar39._2_2_ = uVar104;
  auVar39._0_2_ = uVar104;
  auVar84._0_8_ =
       CONCAT44(((float)(auVar39._0_4_ >> 0x10) - fVar199) * fVar107,
                ((float)(int)(short)uVar50 - fVar198) * fVar63);
  auVar84._8_4_ = ((float)(auVar81._8_4_ >> 0x10) - fVar200) * fVar135;
  auVar84._12_4_ = ((float)(auVar82._12_4_ >> 0x10) - fVar174) * fVar150;
  uVar50 = *(ulong *)(prim + uVar55 * 0x17 + 6);
  uVar104 = (undefined2)(uVar50 >> 0x30);
  auVar225._8_4_ = 0;
  auVar225._0_8_ = uVar50;
  auVar225._12_2_ = uVar104;
  auVar225._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar50 >> 0x20);
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._8_2_ = 0;
  auVar224._0_8_ = uVar50;
  auVar224._10_2_ = uVar104;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._8_2_ = uVar104;
  auVar223._0_8_ = uVar50;
  uVar104 = (undefined2)(uVar50 >> 0x10);
  auVar40._4_8_ = auVar223._8_8_;
  auVar40._2_2_ = uVar104;
  auVar40._0_2_ = uVar104;
  auVar226._0_4_ = ((float)(int)(short)uVar50 - fVar198) * fVar63;
  auVar226._4_4_ = ((float)(auVar40._0_4_ >> 0x10) - fVar199) * fVar107;
  auVar226._8_4_ = ((float)(auVar223._8_4_ >> 0x10) - fVar200) * fVar135;
  auVar226._12_4_ = ((float)(auVar224._12_4_ >> 0x10) - fVar174) * fVar150;
  auVar189._8_4_ = auVar176._8_4_;
  auVar189._0_8_ = auVar176._0_8_;
  auVar189._12_4_ = auVar176._12_4_;
  auVar190 = minps(auVar189,auVar205);
  auVar138._8_4_ = auVar113._8_4_;
  auVar138._0_8_ = auVar113._0_8_;
  auVar138._12_4_ = auVar113._12_4_;
  auVar71 = minps(auVar138,auVar232);
  auVar190 = maxps(auVar190,auVar71);
  auVar139._8_4_ = auVar84._8_4_;
  auVar139._0_8_ = auVar84._0_8_;
  auVar139._12_4_ = auVar84._12_4_;
  auVar71 = minps(auVar139,auVar226);
  auVar153._4_4_ = uVar47;
  auVar153._0_4_ = uVar47;
  auVar153._8_4_ = uVar47;
  auVar153._12_4_ = uVar47;
  auVar71 = maxps(auVar71,auVar153);
  auVar191 = maxps(auVar190,auVar71);
  auVar190 = maxps(auVar176,auVar205);
  auVar71 = maxps(auVar113,auVar232);
  auVar190 = minps(auVar190,auVar71);
  local_228 = auVar191._0_4_ * 0.99999964;
  fStack_224 = auVar191._4_4_ * 0.99999964;
  fStack_220 = auVar191._8_4_ * 0.99999964;
  fStack_21c = auVar191._12_4_ * 0.99999964;
  auVar71 = maxps(auVar84,auVar226);
  uVar47 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar114._4_4_ = uVar47;
  auVar114._0_4_ = uVar47;
  auVar114._8_4_ = uVar47;
  auVar114._12_4_ = uVar47;
  auVar71 = minps(auVar71,auVar114);
  auVar71 = minps(auVar190,auVar71);
  auVar115._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && local_228 <= auVar71._0_4_ * 1.0000004);
  auVar115._4_4_ = -(uint)(1 < (byte)PVar5 && fStack_224 <= auVar71._4_4_ * 1.0000004);
  auVar115._8_4_ = -(uint)(2 < (byte)PVar5 && fStack_220 <= auVar71._8_4_ * 1.0000004);
  auVar115._12_4_ = -(uint)(3 < (byte)PVar5 && fStack_21c <= auVar71._12_4_ * 1.0000004);
  uVar57 = movmskps((int)lVar49,auVar115);
  if (uVar57 == 0) {
    return false;
  }
  uVar57 = uVar57 & 0xff;
  pPVar54 = prim + uVar55 * 0x19 + 0x16;
  local_1d8._0_12_ = mm_lookupmask_ps._240_12_;
  local_1d8._12_4_ = 0;
  local_4a0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_490 = prim;
  local_498 = pPVar54;
LAB_00a43546:
  local_488 = (ulong)uVar57;
  lVar49 = 0;
  if (local_488 != 0) {
    for (; (uVar57 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
    }
  }
  local_488 = local_488 - 1 & local_488;
  iVar41 = *(int *)(prim + lVar49 * 4 + 6);
  uVar47 = 0;
  lVar49 = lVar49 * 0x40;
  lVar7 = 0;
  if (local_488 != 0) {
    for (; (local_488 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  local_3c8 = *(uint *)(prim + 2);
  pPVar1 = pPVar54 + lVar49;
  if (((local_488 != 0) && (uVar50 = local_488 - 1 & local_488, uVar50 != 0)) &&
     (lVar7 = 0, uVar50 != 0)) {
    for (; (uVar50 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  pPVar2 = pPVar54 + lVar49 + 0x10;
  pPVar3 = pPVar54 + lVar49 + 0x20;
  pPVar4 = pPVar54 + lVar49 + 0x30;
  fStack_13c = *(float *)(ray + k * 4 + 0x40);
  fVar151 = *(float *)(ray + k * 4 + 0x50);
  local_5e8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x60);
  local_578._4_4_ = fVar151;
  local_578._0_4_ = fStack_13c;
  fStack_570 = (float)local_5e8._4_4_;
  fStack_56c = 0.0;
  fVar62 = fVar151 * fVar151;
  fVar63 = (float)local_5e8._4_4_ * (float)local_5e8._4_4_;
  fVar105 = fVar62 + fStack_13c * fStack_13c + fVar63;
  auVar85._0_8_ = CONCAT44(fVar62 + fVar62 + 0.0,fVar105);
  auVar85._8_4_ = fVar62 + fVar63 + fVar63;
  auVar85._12_4_ = fVar62 + 0.0 + 0.0;
  auVar192._8_4_ = auVar85._8_4_;
  auVar192._0_8_ = auVar85._0_8_;
  auVar192._12_4_ = auVar85._12_4_;
  auVar71 = rcpss(auVar192,auVar85);
  fVar106 = (2.0 - auVar71._0_4_ * fVar105) * auVar71._0_4_ *
            (((*(float *)(pPVar1 + 8) + *(float *)(pPVar2 + 8) + *(float *)(pPVar3 + 8) +
              *(float *)(pPVar4 + 8)) * 0.25 - *(float *)(ray + k * 4 + 0x20)) *
             (float)local_5e8._4_4_ +
            ((*(float *)(pPVar1 + 4) + *(float *)(pPVar2 + 4) + *(float *)(pPVar3 + 4) +
             *(float *)(pPVar4 + 4)) * 0.25 - *(float *)(ray + k * 4 + 0x10)) * fVar151 +
            ((*(float *)pPVar1 + *(float *)pPVar2 + *(float *)pPVar3 + *(float *)pPVar4) * 0.25 -
            *(float *)(ray + k * 4)) * fStack_13c);
  local_478 = fStack_13c * fVar106 + *(float *)(ray + k * 4);
  local_168 = fVar151 * fVar106 + *(float *)(ray + k * 4 + 0x10);
  local_178 = (float)local_5e8._4_4_ * fVar106 + *(float *)(ray + k * 4 + 0x20);
  local_2e8 = *(float *)pPVar1 - local_478;
  local_2f8 = *(float *)(pPVar1 + 4) - local_168;
  local_158 = *(float *)(pPVar1 + 8) - local_178;
  fStack_43c = *(float *)(pPVar1 + 0xc) - 0.0;
  local_358 = *(float *)pPVar3 - local_478;
  local_368 = *(float *)(pPVar3 + 4) - local_168;
  local_378 = *(float *)(pPVar3 + 8) - local_178;
  fStack_45c = *(float *)(pPVar3 + 0xc) - 0.0;
  local_318 = *(float *)pPVar2 - local_478;
  local_328 = *(float *)(pPVar2 + 4) - local_168;
  local_338 = *(float *)(pPVar2 + 8) - local_178;
  fStack_44c = *(float *)(pPVar2 + 0xc) - 0.0;
  local_478 = *(float *)pPVar4 - local_478;
  local_168 = *(float *)(pPVar4 + 4) - local_168;
  local_178 = *(float *)(pPVar4 + 8) - local_178;
  fStack_46c = *(float *)(pPVar4 + 0xc) - 0.0;
  fStack_2e4 = local_2e8;
  fStack_2e0 = local_2e8;
  fStack_2dc = local_2e8;
  fStack_2f4 = local_2f8;
  fStack_2f0 = local_2f8;
  fStack_2ec = local_2f8;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  local_448 = local_2e8;
  fStack_444 = local_2f8;
  fStack_440 = local_158;
  local_308 = fStack_43c;
  fStack_304 = fStack_43c;
  fStack_300 = fStack_43c;
  fStack_2fc = fStack_43c;
  fVar62 = fVar151 * fVar151;
  fStack_314 = local_318;
  fStack_310 = local_318;
  fStack_30c = local_318;
  fStack_13c = fStack_13c * fStack_13c;
  local_148 = fStack_13c + fVar62 + fVar63;
  fStack_144 = fStack_13c + fVar62 + fVar63;
  fStack_140 = fStack_13c + fVar62 + fVar63;
  fStack_13c = fStack_13c + fVar62 + fVar63;
  fStack_324 = local_328;
  fStack_320 = local_328;
  fStack_31c = local_328;
  fStack_334 = local_338;
  fStack_330 = local_338;
  fStack_32c = local_338;
  local_458 = local_318;
  fStack_454 = local_328;
  fStack_450 = local_338;
  local_348 = fStack_44c;
  fStack_344 = fStack_44c;
  fStack_340 = fStack_44c;
  fStack_33c = fStack_44c;
  fStack_354 = local_358;
  fStack_350 = local_358;
  fStack_34c = local_358;
  fStack_364 = local_368;
  fStack_360 = local_368;
  fStack_35c = local_368;
  fStack_374 = local_378;
  fStack_370 = local_378;
  fStack_36c = local_378;
  local_468 = local_358;
  fStack_464 = local_368;
  fStack_460 = local_378;
  local_388 = fStack_45c;
  fStack_384 = fStack_45c;
  fStack_380 = fStack_45c;
  fStack_37c = fStack_45c;
  fStack_164 = local_168;
  fStack_160 = local_168;
  fStack_15c = local_168;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  fStack_474 = local_168;
  fStack_470 = local_178;
  local_398 = fStack_46c;
  fStack_394 = fStack_46c;
  fStack_390 = fStack_46c;
  fStack_38c = fStack_46c;
  fVar62 = *(float *)(ray + k * 4 + 0x40);
  local_5e8._0_4_ = local_5e8._4_4_;
  fStack_5e0 = (float)local_5e8._4_4_;
  fStack_5dc = (float)local_5e8._4_4_;
  local_3a8 = ABS(local_148);
  fStack_3a4 = ABS(fStack_144);
  fStack_3a0 = ABS(fStack_140);
  fStack_39c = ABS(fStack_13c);
  fVar63 = *(float *)(ray + k * 4 + 0x30);
  local_408 = ZEXT416((uint)fVar106);
  local_1c8 = fVar63 - fVar106;
  fStack_1c4 = local_1c8;
  fStack_1c0 = local_1c8;
  fStack_1bc = local_1c8;
  local_480 = (ulong)local_3c8;
  uStack_3c4 = local_3c8;
  uStack_3c0 = local_3c8;
  uStack_3bc = local_3c8;
  local_3d8 = iVar41;
  iStack_3d4 = iVar41;
  iStack_3d0 = iVar41;
  iStack_3cc = iVar41;
  iVar53 = 1;
  uVar50 = 0;
  bVar52 = false;
  local_1b8 = 0.0;
  fStack_1b4 = 1.0;
  local_208 = local_478;
  fStack_204 = local_478;
  fStack_200 = local_478;
  fStack_1fc = local_478;
  do {
    iVar51 = (int)uVar50;
    local_518 = fStack_1b4 - local_1b8;
    fVar136 = local_518 * 0.11111111;
    uStack_1b0 = 0;
    uStack_1ac = 0;
    fStack_514 = local_518;
    fStack_510 = local_518;
    fStack_50c = local_518;
    local_528._4_4_ = local_1b8;
    local_528._0_4_ = local_1b8;
    fStack_520 = local_1b8;
    fStack_51c = local_1b8;
    fVar239 = local_518 * 0.0 + local_1b8;
    fVar240 = local_518 * 0.33333334 + local_1b8;
    fVar243 = local_518 * 0.6666667 + local_1b8;
    fVar244 = local_518 * 1.0 + local_1b8;
    fVar212 = 1.0 - fVar239;
    fVar229 = 1.0 - fVar240;
    fVar231 = 1.0 - fVar243;
    fVar238 = 1.0 - fVar244;
    fVar107 = fVar239 * fVar212;
    fVar108 = fVar240 * fVar229;
    fVar109 = fVar243 * fVar231;
    fVar135 = fVar244 * fVar238;
    fVar137 = fVar212 * fVar212 * fVar212;
    fVar152 = fVar229 * fVar229 * fVar229;
    fVar173 = fVar231 * fVar231 * fVar231;
    fVar187 = fVar238 * fVar238 * fVar238;
    fVar255 = fVar239 * fVar239 * fVar239;
    fVar263 = fVar240 * fVar240 * fVar240;
    fVar265 = fVar243 * fVar243 * fVar243;
    fVar267 = fVar244 * fVar244 * fVar244;
    fVar150 = fVar137 * 0.16666667;
    fVar172 = fVar152 * 0.16666667;
    fVar198 = fVar173 * 0.16666667;
    fVar199 = fVar187 * 0.16666667;
    fVar230 = (fVar239 * fVar107 * 6.0 + fVar212 * fVar107 * 12.0 + fVar137 * 4.0 + fVar255) *
              0.16666667;
    fVar242 = (fVar240 * fVar108 * 6.0 + fVar229 * fVar108 * 12.0 + fVar152 * 4.0 + fVar263) *
              0.16666667;
    fVar253 = (fVar243 * fVar109 * 6.0 + fVar231 * fVar109 * 12.0 + fVar173 * 4.0 + fVar265) *
              0.16666667;
    fVar254 = (fVar244 * fVar135 * 6.0 + fVar238 * fVar135 * 12.0 + fVar187 * 4.0 + fVar267) *
              0.16666667;
    fVar137 = (fVar212 * fVar107 * 6.0 + fVar239 * fVar107 * 12.0 + fVar255 * 4.0 + fVar137) *
              0.16666667;
    fVar152 = (fVar229 * fVar108 * 6.0 + fVar240 * fVar108 * 12.0 + fVar263 * 4.0 + fVar152) *
              0.16666667;
    fVar185 = (fVar231 * fVar109 * 6.0 + fVar243 * fVar109 * 12.0 + fVar265 * 4.0 + fVar173) *
              0.16666667;
    fVar210 = (fVar238 * fVar135 * 6.0 + fVar244 * fVar135 * 12.0 + fVar267 * 4.0 + fVar187) *
              0.16666667;
    fVar255 = fVar255 * 0.16666667;
    fVar263 = fVar263 * 0.16666667;
    fVar265 = fVar265 * 0.16666667;
    fVar267 = fVar267 * 0.16666667;
    fVar287 = local_2e8 * fVar150 + local_318 * fVar230 + local_358 * fVar137 + local_208 * fVar255;
    fVar289 = fStack_2e4 * fVar172 +
              fStack_314 * fVar242 + fStack_354 * fVar152 + fStack_204 * fVar263;
    fVar290 = fStack_2e0 * fVar198 +
              fStack_310 * fVar253 + fStack_350 * fVar185 + fStack_200 * fVar265;
    fVar291 = fStack_2dc * fVar199 +
              fStack_30c * fVar254 + fStack_34c * fVar210 + fStack_1fc * fVar267;
    fVar276 = local_2f8 * fVar150 + local_328 * fVar230 + local_368 * fVar137 + local_168 * fVar255;
    fVar264 = fStack_2f4 * fVar172 +
              fStack_324 * fVar242 + fStack_364 * fVar152 + fStack_164 * fVar263;
    fVar266 = fStack_2f0 * fVar198 +
              fStack_320 * fVar253 + fStack_360 * fVar185 + fStack_160 * fVar265;
    fVar268 = fStack_2ec * fVar199 +
              fStack_31c * fVar254 + fStack_35c * fVar210 + fStack_15c * fVar267;
    fVar200 = local_158 * fVar150 + local_338 * fVar230 + local_378 * fVar137 + local_178 * fVar255;
    fVar174 = fStack_154 * fVar172 +
              fStack_334 * fVar242 + fStack_374 * fVar152 + fStack_174 * fVar263;
    fVar186 = fStack_150 * fVar198 +
              fStack_330 * fVar253 + fStack_370 * fVar185 + fStack_170 * fVar265;
    fVar211 = fStack_14c * fVar199 +
              fStack_32c * fVar254 + fStack_36c * fVar210 + fStack_16c * fVar267;
    fVar173 = fVar150 * local_308 + fVar230 * local_348 + fVar137 * local_388 + fVar255 * local_398;
    fVar187 = fVar172 * fStack_304 +
              fVar242 * fStack_344 + fVar152 * fStack_384 + fVar263 * fStack_394;
    auVar140._0_8_ = CONCAT44(fVar187,fVar173);
    auVar140._8_4_ =
         fVar198 * fStack_300 + fVar253 * fStack_340 + fVar185 * fStack_380 + fVar265 * fStack_390;
    auVar140._12_4_ =
         fVar199 * fStack_2fc + fVar254 * fStack_33c + fVar210 * fStack_37c + fVar267 * fStack_38c;
    fVar137 = -fVar212 * fVar212 * 0.5;
    fVar150 = -fVar229 * fVar229 * 0.5;
    fVar152 = -fVar231 * fVar231 * 0.5;
    fVar172 = -fVar238 * fVar238 * 0.5;
    fVar230 = (-fVar239 * fVar239 - fVar107 * 4.0) * 0.5;
    fVar198 = (-fVar240 * fVar240 - fVar108 * 4.0) * 0.5;
    fVar199 = (-fVar243 * fVar243 - fVar109 * 4.0) * 0.5;
    fVar185 = (-fVar244 * fVar244 - fVar135 * 4.0) * 0.5;
    fVar107 = (fVar107 * 4.0 + fVar212 * fVar212) * 0.5;
    fVar108 = (fVar108 * 4.0 + fVar229 * fVar229) * 0.5;
    fVar109 = (fVar109 * 4.0 + fVar231 * fVar231) * 0.5;
    fVar135 = (fVar135 * 4.0 + fVar238 * fVar238) * 0.5;
    fVar242 = fVar239 * fVar239 * 0.5;
    fVar210 = fVar240 * fVar240 * 0.5;
    fVar212 = fVar243 * fVar243 * 0.5;
    fVar229 = fVar244 * fVar244 * 0.5;
    fVar255 = (local_2e8 * fVar137 + local_318 * fVar230 + local_358 * fVar107 + local_208 * fVar242
              ) * fVar136;
    local_508._0_4_ =
         (fStack_2e4 * fVar150 + fStack_314 * fVar198 + fStack_354 * fVar108 + fStack_204 * fVar210)
         * fVar136;
    local_508._4_4_ =
         (fStack_2e0 * fVar152 + fStack_310 * fVar199 + fStack_350 * fVar109 + fStack_200 * fVar212)
         * fVar136;
    fStack_500 = (fStack_2dc * fVar172 +
                 fStack_30c * fVar185 + fStack_34c * fVar135 + fStack_1fc * fVar229) * fVar136;
    fVar263 = (local_2f8 * fVar137 + local_328 * fVar230 + local_368 * fVar107 + local_168 * fVar242
              ) * fVar136;
    fVar267 = (fStack_2f4 * fVar150 +
              fStack_324 * fVar198 + fStack_364 * fVar108 + fStack_164 * fVar210) * fVar136;
    local_4b8._0_8_ = CONCAT44(fVar267,fVar263);
    local_4b8._8_4_ =
         (fStack_2f0 * fVar152 + fStack_320 * fVar199 + fStack_360 * fVar109 + fStack_160 * fVar212)
         * fVar136;
    local_4b8._12_4_ =
         (fStack_2ec * fVar172 + fStack_31c * fVar185 + fStack_35c * fVar135 + fStack_15c * fVar229)
         * fVar136;
    local_4c8 = (local_158 * fVar137 +
                local_338 * fVar230 + local_378 * fVar107 + local_178 * fVar242) * fVar136;
    fStack_4c4 = (fStack_154 * fVar150 +
                 fStack_334 * fVar198 + fStack_374 * fVar108 + fStack_174 * fVar210) * fVar136;
    fStack_4c0 = (fStack_150 * fVar152 +
                 fStack_330 * fVar199 + fStack_370 * fVar109 + fStack_170 * fVar212) * fVar136;
    fStack_4bc = (fStack_14c * fVar172 +
                 fStack_32c * fVar185 + fStack_36c * fVar135 + fStack_16c * fVar229) * fVar136;
    fVar283 = fVar136 * (fVar150 * fStack_304 +
                        fVar198 * fStack_344 + fVar108 * fStack_384 + fVar210 * fStack_394);
    fVar284 = fVar136 * (fVar152 * fStack_300 +
                        fVar199 * fStack_340 + fVar109 * fStack_380 + fVar212 * fStack_390);
    fVar285 = fVar136 * (fVar172 * fStack_2fc +
                        fVar185 * fStack_33c + fVar135 * fStack_37c + fVar229 * fStack_38c);
    auVar260._4_4_ = auVar140._8_4_;
    auVar260._0_4_ = fVar187;
    auVar260._8_4_ = auVar140._12_4_;
    auVar260._12_4_ = 0;
    auVar227._0_8_ = CONCAT44(auVar140._8_4_ - fVar284,fVar187 - fVar283);
    auVar227._8_4_ = auVar140._12_4_ - fVar285;
    auVar227._12_4_ = 0;
    local_418._0_4_ = fVar264 - fVar276;
    local_418._4_4_ = fVar266 - fVar264;
    fStack_410 = fVar268 - fVar266;
    fStack_40c = 0.0 - fVar268;
    local_428._0_4_ = fVar174 - fVar200;
    local_428._4_4_ = fVar186 - fVar174;
    fStack_420 = fVar211 - fVar186;
    fStack_41c = 0.0 - fVar211;
    fVar243 = fVar263 * (float)local_428._0_4_ - local_4c8 * (float)local_418._0_4_;
    fVar244 = fVar267 * (float)local_428._4_4_ - fStack_4c4 * (float)local_418._4_4_;
    fVar253 = local_4b8._8_4_ * fStack_420 - fStack_4c0 * fStack_410;
    fVar254 = local_4b8._12_4_ * fStack_41c - fStack_4bc * fStack_40c;
    local_438 = fVar289 - fVar287;
    fStack_434 = fVar290 - fVar289;
    fStack_430 = fVar291 - fVar290;
    fStack_42c = 0.0 - fVar291;
    fVar152 = local_4c8 * local_438 - fVar255 * (float)local_428._0_4_;
    fVar198 = fStack_4c4 * fStack_434 - (float)local_508._0_4_ * (float)local_428._4_4_;
    fVar185 = fStack_4c0 * fStack_430 - (float)local_508._4_4_ * fStack_420;
    fVar212 = fStack_4bc * fStack_42c - fStack_500 * fStack_41c;
    fVar231 = fVar255 * (float)local_418._0_4_ - fVar263 * local_438;
    fVar238 = (float)local_508._0_4_ * (float)local_418._4_4_ - fVar267 * fStack_434;
    fVar239 = (float)local_508._4_4_ * fStack_410 - local_4b8._8_4_ * fStack_430;
    fVar240 = fStack_500 * fStack_40c - local_4b8._12_4_ * fStack_42c;
    auVar116._0_4_ = (float)local_428._0_4_ * (float)local_428._0_4_;
    auVar116._4_4_ = (float)local_428._4_4_ * (float)local_428._4_4_;
    auVar116._8_4_ = fStack_420 * fStack_420;
    auVar116._12_4_ = fStack_41c * fStack_41c;
    auVar177._0_4_ =
         local_438 * local_438 + (float)local_418._0_4_ * (float)local_418._0_4_ + auVar116._0_4_;
    auVar177._4_4_ =
         fStack_434 * fStack_434 + (float)local_418._4_4_ * (float)local_418._4_4_ + auVar116._4_4_;
    auVar177._8_4_ = fStack_430 * fStack_430 + fStack_410 * fStack_410 + auVar116._8_4_;
    auVar177._12_4_ = fStack_42c * fStack_42c + fStack_40c * fStack_40c + auVar116._12_4_;
    auVar71 = rcpps(auVar116,auVar177);
    fVar108 = auVar71._0_4_;
    fVar109 = auVar71._4_4_;
    fVar135 = auVar71._8_4_;
    fVar150 = auVar71._12_4_;
    fVar108 = (1.0 - fVar108 * auVar177._0_4_) * fVar108 + fVar108;
    fVar109 = (1.0 - fVar109 * auVar177._4_4_) * fVar109 + fVar109;
    fVar135 = (1.0 - fVar135 * auVar177._8_4_) * fVar135 + fVar135;
    fVar150 = (1.0 - fVar150 * auVar177._12_4_) * fVar150 + fVar150;
    auVar86._8_4_ = local_4b8._8_4_;
    auVar86._0_8_ = local_4b8._0_8_;
    auVar86._12_4_ = local_4b8._12_4_;
    fVar172 = (float)local_428._0_4_ * fVar267 - (float)local_418._0_4_ * fStack_4c4;
    fVar199 = (float)local_428._4_4_ * local_4b8._8_4_ - (float)local_418._4_4_ * fStack_4c0;
    fVar210 = fStack_420 * local_4b8._12_4_ - fStack_410 * fStack_4bc;
    fVar229 = fStack_41c * 0.0 - fStack_40c * 0.0;
    local_4e8 = fStack_4c4;
    fStack_4e4 = fStack_4c0;
    fStack_4e0 = fStack_4bc;
    fStack_4dc = 0.0;
    fVar265 = local_438 * fStack_4c4 - (float)local_428._0_4_ * (float)local_508._0_4_;
    fVar269 = fStack_434 * fStack_4c0 - (float)local_428._4_4_ * (float)local_508._4_4_;
    fVar272 = fStack_430 * fStack_4bc - fStack_420 * fStack_500;
    fVar274 = fStack_42c * 0.0 - fStack_41c * 0.0;
    _local_4d8 = auVar86 >> 0x20;
    uStack_4fc = 0;
    fVar270 = (float)local_418._0_4_ * (float)local_508._0_4_ - local_438 * fVar267;
    fVar273 = (float)local_418._4_4_ * (float)local_508._4_4_ - fStack_434 * local_4b8._8_4_;
    fVar275 = fStack_410 * fStack_500 - fStack_430 * local_4b8._12_4_;
    fVar277 = fStack_40c * 0.0 - fStack_42c * 0.0;
    auVar233._0_4_ = (fVar243 * fVar243 + fVar152 * fVar152 + fVar231 * fVar231) * fVar108;
    auVar233._4_4_ = (fVar244 * fVar244 + fVar198 * fVar198 + fVar238 * fVar238) * fVar109;
    auVar233._8_4_ = (fVar253 * fVar253 + fVar185 * fVar185 + fVar239 * fVar239) * fVar135;
    auVar233._12_4_ = (fVar254 * fVar254 + fVar212 * fVar212 + fVar240 * fVar240) * fVar150;
    auVar154._0_4_ = (fVar172 * fVar172 + fVar265 * fVar265 + fVar270 * fVar270) * fVar108;
    auVar154._4_4_ = (fVar199 * fVar199 + fVar269 * fVar269 + fVar273 * fVar273) * fVar109;
    auVar154._8_4_ = (fVar210 * fVar210 + fVar272 * fVar272 + fVar275 * fVar275) * fVar135;
    auVar154._12_4_ = (fVar229 * fVar229 + fVar274 * fVar274 + fVar277 * fVar277) * fVar150;
    auVar234 = maxps(auVar233,auVar154);
    auVar278._0_4_ =
         fVar136 * (fVar137 * local_308 +
                   fVar230 * local_348 + fVar107 * local_388 + fVar242 * local_398) + fVar173;
    auVar278._4_4_ = fVar283 + fVar187;
    auVar278._8_4_ = fVar284 + auVar140._8_4_;
    auVar278._12_4_ = fVar285 + auVar140._12_4_;
    auVar245._8_4_ = auVar140._8_4_;
    auVar245._0_8_ = auVar140._0_8_;
    auVar245._12_4_ = auVar140._12_4_;
    auVar190 = maxps(auVar245,auVar278);
    auVar155._8_4_ = auVar227._8_4_;
    auVar155._0_8_ = auVar227._0_8_;
    auVar155._12_4_ = 0;
    auVar71 = maxps(auVar155,auVar260);
    auVar246 = maxps(auVar190,auVar71);
    auVar71 = minps(auVar140,auVar278);
    auVar190 = minps(auVar227,auVar260);
    auVar191 = minps(auVar71,auVar190);
    auVar71 = sqrtps(auVar86 >> 0x20,auVar234);
    auVar190 = rsqrtps(auVar71,auVar177);
    fVar107 = auVar190._0_4_;
    fVar109 = auVar190._4_4_;
    fVar136 = auVar190._8_4_;
    fVar137 = auVar190._12_4_;
    fVar108 = fVar107 * 1.5 - fVar107 * fVar107 * auVar177._0_4_ * 0.5 * fVar107;
    fVar135 = fVar109 * 1.5 - fVar109 * fVar109 * auVar177._4_4_ * 0.5 * fVar109;
    auVar279._0_8_ = CONCAT44(fVar135,fVar108);
    auVar279._8_4_ = fVar136 * 1.5 - fVar136 * fVar136 * auVar177._8_4_ * 0.5 * fVar136;
    auVar279._12_4_ = fVar137 * 1.5 - fVar137 * fVar137 * auVar177._12_4_ * 0.5 * fVar137;
    fVar150 = 0.0 - fVar276;
    fVar152 = 0.0 - fVar264;
    fVar172 = 0.0 - fVar266;
    fVar173 = 0.0 - fVar268;
    local_4f8 = 0.0 - fVar200;
    fStack_4f4 = 0.0 - fVar174;
    fStack_4f0 = 0.0 - fVar186;
    fStack_4ec = 0.0 - fVar211;
    fVar107 = 0.0 - fVar287;
    fVar109 = 0.0 - fVar289;
    fVar136 = 0.0 - fVar290;
    fVar137 = 0.0 - fVar291;
    local_218._8_4_ = auVar279._8_4_;
    local_218._0_8_ = auVar279._0_8_;
    local_218._12_4_ = auVar279._12_4_;
    local_188 = fVar62 * local_438 * fVar108 +
                fVar151 * (float)local_418._0_4_ * fVar108 +
                (float)local_5e8._4_4_ * (float)local_428._0_4_ * fVar108;
    fStack_184 = fVar62 * fStack_434 * fVar135 +
                 fVar151 * (float)local_418._4_4_ * fVar135 +
                 (float)local_5e8._4_4_ * (float)local_428._4_4_ * fVar135;
    fStack_180 = fVar62 * fStack_430 * auVar279._8_4_ +
                 fVar151 * fStack_410 * auVar279._8_4_ +
                 (float)local_5e8._4_4_ * fStack_420 * auVar279._8_4_;
    fStack_17c = fVar62 * fStack_42c * auVar279._12_4_ +
                 fVar151 * fStack_40c * auVar279._12_4_ +
                 (float)local_5e8._4_4_ * fStack_41c * auVar279._12_4_;
    fVar231 = local_438 * fVar108 * fVar107 +
              (float)local_418._0_4_ * fVar108 * fVar150 +
              (float)local_428._0_4_ * fVar108 * local_4f8;
    fVar238 = fStack_434 * fVar135 * fVar109 +
              (float)local_418._4_4_ * fVar135 * fVar152 +
              (float)local_428._4_4_ * fVar135 * fStack_4f4;
    fVar239 = fStack_430 * auVar279._8_4_ * fVar136 +
              fStack_410 * auVar279._8_4_ * fVar172 + fStack_420 * auVar279._8_4_ * fStack_4f0;
    fVar240 = fStack_42c * auVar279._12_4_ * fVar137 +
              fStack_40c * auVar279._12_4_ * fVar173 + fStack_41c * auVar279._12_4_ * fStack_4ec;
    local_1a8 = (fVar62 * fVar107 + fVar151 * fVar150 + (float)local_5e8._4_4_ * local_4f8) -
                local_188 * fVar231;
    fStack_1a4 = (fVar62 * fVar109 + fVar151 * fVar152 + (float)local_5e8._4_4_ * fStack_4f4) -
                 fStack_184 * fVar238;
    fStack_1a0 = (fVar62 * fVar136 + fVar151 * fVar172 + (float)local_5e8._4_4_ * fStack_4f0) -
                 fStack_180 * fVar239;
    fStack_19c = (fVar62 * fVar137 + fVar151 * fVar173 + (float)local_5e8._4_4_ * fStack_4ec) -
                 fStack_17c * fVar240;
    fVar210 = (fVar107 * fVar107 + fVar150 * fVar150 + local_4f8 * local_4f8) - fVar231 * fVar231;
    fVar212 = (fVar109 * fVar109 + fVar152 * fVar152 + fStack_4f4 * fStack_4f4) - fVar238 * fVar238;
    fVar229 = (fVar136 * fVar136 + fVar172 * fVar172 + fStack_4f0 * fStack_4f0) - fVar239 * fVar239;
    fVar230 = (fVar137 * fVar137 + fVar173 * fVar173 + fStack_4ec * fStack_4ec) - fVar240 * fVar240;
    fVar187 = (auVar246._0_4_ + auVar71._0_4_) * 1.0000002;
    fVar198 = (auVar246._4_4_ + auVar71._4_4_) * 1.0000002;
    fVar199 = (auVar246._8_4_ + auVar71._8_4_) * 1.0000002;
    fVar185 = (auVar246._12_4_ + auVar71._12_4_) * 1.0000002;
    fVar187 = fVar210 - fVar187 * fVar187;
    fVar198 = fVar212 - fVar198 * fVar198;
    fVar199 = fVar229 - fVar199 * fVar199;
    fVar185 = fVar230 - fVar185 * fVar185;
    local_198 = local_188 * local_188;
    fStack_194 = fStack_184 * fStack_184;
    fStack_190 = fStack_180 * fStack_180;
    fStack_18c = fStack_17c * fStack_17c;
    local_3b8 = local_148 - local_198;
    fStack_3b4 = fStack_144 - fStack_194;
    fStack_3b0 = fStack_140 - fStack_190;
    fStack_3ac = fStack_13c - fStack_18c;
    local_1a8 = local_1a8 + local_1a8;
    fStack_1a4 = fStack_1a4 + fStack_1a4;
    fStack_1a0 = fStack_1a0 + fStack_1a0;
    fStack_19c = fStack_19c + fStack_19c;
    local_538._0_4_ = local_3b8 * 4.0;
    local_538._4_4_ = fStack_3b4 * 4.0;
    fStack_530 = fStack_3b0 * 4.0;
    fStack_52c = fStack_3ac * 4.0;
    auVar247._0_4_ = local_1a8 * local_1a8 - (float)local_538._0_4_ * fVar187;
    auVar247._4_4_ = fStack_1a4 * fStack_1a4 - (float)local_538._4_4_ * fVar198;
    auVar247._8_4_ = fStack_1a0 * fStack_1a0 - fStack_530 * fVar199;
    auVar247._12_4_ = fStack_19c * fStack_19c - fStack_52c * fVar185;
    auVar141._0_4_ = (auVar191._0_4_ - auVar71._0_4_) * 0.99999976;
    auVar141._4_4_ = (auVar191._4_4_ - auVar71._4_4_) * 0.99999976;
    auVar141._8_4_ = (auVar191._8_4_ - auVar71._8_4_) * 0.99999976;
    auVar141._12_4_ = (auVar191._12_4_ - auVar71._12_4_) * 0.99999976;
    auVar178._4_4_ = -(uint)(0.0 <= auVar247._4_4_);
    auVar178._0_4_ = -(uint)(0.0 <= auVar247._0_4_);
    auVar178._8_4_ = -(uint)(0.0 <= auVar247._8_4_);
    auVar178._12_4_ = -(uint)(0.0 <= auVar247._12_4_);
    iVar41 = movmskps(iVar41,auVar178);
    if (iVar41 == 0) {
      iVar41 = 0;
      auVar142 = _DAT_01f7aa00;
      auVar235 = _DAT_01f7a9f0;
    }
    else {
      auVar190 = sqrtps(auVar279,auVar247);
      bVar56 = 0.0 <= auVar247._0_4_;
      uVar57 = -(uint)bVar56;
      bVar8 = 0.0 <= auVar247._4_4_;
      uVar58 = -(uint)bVar8;
      bVar9 = 0.0 <= auVar247._8_4_;
      uVar59 = -(uint)bVar9;
      bVar10 = 0.0 <= auVar247._12_4_;
      uVar60 = -(uint)bVar10;
      auVar156._0_4_ = local_3b8 + local_3b8;
      auVar156._4_4_ = fStack_3b4 + fStack_3b4;
      auVar156._8_4_ = fStack_3b0 + fStack_3b0;
      auVar156._12_4_ = fStack_3ac + fStack_3ac;
      auVar71 = rcpps(auVar141,auVar156);
      fVar242 = auVar71._0_4_;
      fVar243 = auVar71._4_4_;
      fVar244 = auVar71._8_4_;
      fVar253 = auVar71._12_4_;
      fVar242 = (1.0 - auVar156._0_4_ * fVar242) * fVar242 + fVar242;
      fVar243 = (1.0 - auVar156._4_4_ * fVar243) * fVar243 + fVar243;
      fVar244 = (1.0 - auVar156._8_4_ * fVar244) * fVar244 + fVar244;
      fVar253 = (1.0 - auVar156._12_4_ * fVar253) * fVar253 + fVar253;
      fVar254 = (-local_1a8 - auVar190._0_4_) * fVar242;
      fVar265 = (-fStack_1a4 - auVar190._4_4_) * fVar243;
      fVar269 = (-fStack_1a0 - auVar190._8_4_) * fVar244;
      fVar272 = (-fStack_19c - auVar190._12_4_) * fVar253;
      fVar242 = (auVar190._0_4_ - local_1a8) * fVar242;
      fVar243 = (auVar190._4_4_ - fStack_1a4) * fVar243;
      fVar244 = (auVar190._8_4_ - fStack_1a0) * fVar244;
      fVar253 = (auVar190._12_4_ - fStack_19c) * fVar253;
      local_1f8 = (local_188 * fVar254 + fVar231) * fVar108;
      fStack_1f4 = (fStack_184 * fVar265 + fVar238) * fVar135;
      fStack_1f0 = (fStack_180 * fVar269 + fVar239) * auVar279._8_4_;
      fStack_1ec = (fStack_17c * fVar272 + fVar240) * auVar279._12_4_;
      local_1e8 = (local_188 * fVar242 + fVar231) * fVar108;
      fStack_1e4 = (fStack_184 * fVar243 + fVar238) * fVar135;
      fStack_1e0 = (fStack_180 * fVar244 + fVar239) * auVar279._8_4_;
      fStack_1dc = (fStack_17c * fVar253 + fVar240) * auVar279._12_4_;
      auVar157._0_4_ = (uint)fVar254 & uVar57;
      auVar157._4_4_ = (uint)fVar265 & uVar58;
      auVar157._8_4_ = (uint)fVar269 & uVar59;
      auVar157._12_4_ = (uint)fVar272 & uVar60;
      auVar235._0_8_ = CONCAT44(~uVar58,~uVar57) & 0x7f8000007f800000;
      auVar235._8_4_ = ~uVar59 & 0x7f800000;
      auVar235._12_4_ = ~uVar60 & 0x7f800000;
      auVar235 = auVar235 | auVar157;
      auVar280._0_4_ = (uint)fVar242 & uVar57;
      auVar280._4_4_ = (uint)fVar243 & uVar58;
      auVar280._8_4_ = (uint)fVar244 & uVar59;
      auVar280._12_4_ = (uint)fVar253 & uVar60;
      auVar142._0_8_ = CONCAT44(~uVar58,~uVar57) & 0xff800000ff800000;
      auVar142._8_4_ = ~uVar59 & 0xff800000;
      auVar142._12_4_ = ~uVar60 & 0xff800000;
      auVar142 = auVar142 | auVar280;
      auVar261._0_8_ = CONCAT44(fStack_194,local_198) & 0x7fffffff7fffffff;
      auVar261._8_4_ = ABS(fStack_190);
      auVar261._12_4_ = ABS(fStack_18c);
      auVar20._4_4_ = fStack_3a4;
      auVar20._0_4_ = local_3a8;
      auVar20._8_4_ = fStack_3a0;
      auVar20._12_4_ = fStack_39c;
      auVar71 = maxps(auVar20,auVar261);
      fVar242 = auVar71._0_4_ * 1.9073486e-06;
      fVar243 = auVar71._4_4_ * 1.9073486e-06;
      fVar244 = auVar71._8_4_ * 1.9073486e-06;
      fVar253 = auVar71._12_4_ * 1.9073486e-06;
      auVar281._0_4_ = -(uint)(ABS(local_3b8) < fVar242 && bVar56);
      auVar281._4_4_ = -(uint)(ABS(fStack_3b4) < fVar243 && bVar8);
      auVar281._8_4_ = -(uint)(ABS(fStack_3b0) < fVar244 && bVar9);
      auVar281._12_4_ = -(uint)(ABS(fStack_3ac) < fVar253 && bVar10);
      iVar41 = movmskps(iVar41,auVar281);
      if (iVar41 != 0) {
        uVar57 = -(uint)(fVar187 <= 0.0);
        uVar58 = -(uint)(fVar198 <= 0.0);
        uVar59 = -(uint)(fVar199 <= 0.0);
        uVar60 = -(uint)(fVar185 <= 0.0);
        auVar241._0_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar281._0_4_;
        auVar241._4_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar281._4_4_;
        auVar241._8_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar281._8_4_;
        auVar241._12_4_ = (uVar60 & 0xff800000 | ~uVar60 & 0x7f800000) & auVar281._12_4_;
        auVar262._0_4_ = ~auVar281._0_4_ & auVar235._0_4_;
        auVar262._4_4_ = ~auVar281._4_4_ & auVar235._4_4_;
        auVar262._8_4_ = ~auVar281._8_4_ & auVar235._8_4_;
        auVar262._12_4_ = ~auVar281._12_4_ & auVar235._12_4_;
        auVar236._0_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar281._0_4_;
        auVar236._4_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar281._4_4_;
        auVar236._8_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar281._8_4_;
        auVar236._12_4_ = (uVar60 & 0x7f800000 | ~uVar60 & 0xff800000) & auVar281._12_4_;
        auVar282._0_4_ = ~auVar281._0_4_ & auVar142._0_4_;
        auVar282._4_4_ = ~auVar281._4_4_ & auVar142._4_4_;
        auVar282._8_4_ = ~auVar281._8_4_ & auVar142._8_4_;
        auVar282._12_4_ = ~auVar281._12_4_ & auVar142._12_4_;
        auVar178._4_4_ = -(uint)((fVar243 <= ABS(fStack_3b4) || fVar198 <= 0.0) && bVar8);
        auVar178._0_4_ = -(uint)((fVar242 <= ABS(local_3b8) || fVar187 <= 0.0) && bVar56);
        auVar178._8_4_ = -(uint)((fVar244 <= ABS(fStack_3b0) || fVar199 <= 0.0) && bVar9);
        auVar178._12_4_ = -(uint)((fVar253 <= ABS(fStack_3ac) || fVar185 <= 0.0) && bVar10);
        auVar142 = auVar282 | auVar236;
        auVar235 = auVar262 | auVar241;
      }
    }
    auVar179._0_4_ = (auVar178._0_4_ << 0x1f) >> 0x1f;
    auVar179._4_4_ = (auVar178._4_4_ << 0x1f) >> 0x1f;
    auVar179._8_4_ = (auVar178._8_4_ << 0x1f) >> 0x1f;
    auVar179._12_4_ = (auVar178._12_4_ << 0x1f) >> 0x1f;
    auVar179 = auVar179 & local_1d8;
    iVar41 = movmskps(iVar41,auVar179);
    pauVar46 = (undefined1 (*) [16])CONCAT44(uVar47,iVar41);
    if (iVar41 != 0) {
      fVar187 = *(float *)(ray + k * 4 + 0x80);
      auVar288._0_4_ = fVar187 - (float)local_408._0_4_;
      auVar288._4_4_ = auVar288._0_4_;
      auVar288._8_4_ = auVar288._0_4_;
      auVar288._12_4_ = auVar288._0_4_;
      auVar191 = minps(auVar288,auVar142);
      auVar24._4_4_ = fStack_1c4;
      auVar24._0_4_ = local_1c8;
      auVar24._8_4_ = fStack_1c0;
      auVar24._12_4_ = fStack_1bc;
      auVar190 = maxps(auVar24,auVar235);
      auVar143._0_4_ = fVar255 * fVar62 + fVar263 * fVar151 + local_4c8 * (float)local_5e8._4_4_;
      auVar143._4_4_ =
           (float)local_508._0_4_ * fVar62 + fVar267 * fVar151 + fStack_4c4 * (float)local_5e8._4_4_
      ;
      auVar143._8_4_ =
           (float)local_508._4_4_ * fVar62 +
           local_4b8._8_4_ * fVar151 + fStack_4c0 * (float)local_5e8._4_4_;
      auVar143._12_4_ =
           fStack_500 * fVar62 + local_4b8._12_4_ * fVar151 + fStack_4bc * (float)local_5e8._4_4_;
      auVar71 = rcpps(_local_5e8,auVar143);
      fVar198 = auVar71._0_4_;
      fVar199 = auVar71._4_4_;
      fVar185 = auVar71._8_4_;
      fVar242 = auVar71._12_4_;
      fVar107 = ((1.0 - auVar143._0_4_ * fVar198) * fVar198 + fVar198) *
                -(fVar107 * fVar255 + fVar150 * fVar263 + local_4f8 * local_4c8);
      fVar109 = ((1.0 - auVar143._4_4_ * fVar199) * fVar199 + fVar199) *
                -(fVar109 * (float)local_508._0_4_ + fVar152 * fVar267 + fStack_4f4 * fStack_4c4);
      fVar136 = ((1.0 - auVar143._8_4_ * fVar185) * fVar185 + fVar185) *
                -(fVar136 * (float)local_508._4_4_ +
                 fVar172 * local_4b8._8_4_ + fStack_4f0 * fStack_4c0);
      fVar137 = ((1.0 - auVar143._12_4_ * fVar242) * fVar242 + fVar242) *
                -(fVar137 * fStack_500 + fVar173 * local_4b8._12_4_ + fStack_4ec * fStack_4bc);
      uVar57 = -(uint)(auVar143._0_4_ < 0.0 || ABS(auVar143._0_4_) < 1e-18);
      uVar58 = -(uint)(auVar143._4_4_ < 0.0 || ABS(auVar143._4_4_) < 1e-18);
      uVar59 = -(uint)(auVar143._8_4_ < 0.0 || ABS(auVar143._8_4_) < 1e-18);
      uVar60 = -(uint)(auVar143._12_4_ < 0.0 || ABS(auVar143._12_4_) < 1e-18);
      auVar158._0_8_ = CONCAT44(uVar58,uVar57) & 0xff800000ff800000;
      auVar158._8_4_ = uVar59 & 0xff800000;
      auVar158._12_4_ = uVar60 & 0xff800000;
      auVar87._0_4_ = ~uVar57 & (uint)fVar107;
      auVar87._4_4_ = ~uVar58 & (uint)fVar109;
      auVar87._8_4_ = ~uVar59 & (uint)fVar136;
      auVar87._12_4_ = ~uVar60 & (uint)fVar137;
      auVar190 = maxps(auVar190,auVar87 | auVar158);
      uVar57 = -(uint)(0.0 < auVar143._0_4_ || ABS(auVar143._0_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar143._4_4_ || ABS(auVar143._4_4_) < 1e-18);
      uVar59 = -(uint)(0.0 < auVar143._8_4_ || ABS(auVar143._8_4_) < 1e-18);
      uVar60 = -(uint)(0.0 < auVar143._12_4_ || ABS(auVar143._12_4_) < 1e-18);
      auVar88._0_8_ = CONCAT44(uVar58,uVar57) & 0x7f8000007f800000;
      auVar88._8_4_ = uVar59 & 0x7f800000;
      auVar88._12_4_ = uVar60 & 0x7f800000;
      auVar144._0_4_ = ~uVar57 & (uint)fVar107;
      auVar144._4_4_ = ~uVar58 & (uint)fVar109;
      auVar144._8_4_ = ~uVar59 & (uint)fVar136;
      auVar144._12_4_ = ~uVar60 & (uint)fVar137;
      auVar191 = minps(auVar191,auVar144 | auVar88);
      auVar159._0_4_ = (0.0 - fVar264) * -fVar267 + (0.0 - fVar174) * -fStack_4c4;
      auVar159._4_4_ = (0.0 - fVar266) * -local_4b8._8_4_ + (0.0 - fVar186) * -fStack_4c0;
      auVar159._8_4_ = (0.0 - fVar268) * -local_4b8._12_4_ + (0.0 - fVar211) * -fStack_4bc;
      auVar159._12_4_ = 0x80000000;
      auVar117._0_4_ =
           -(float)local_508._0_4_ * fVar62 +
           -fVar267 * fVar151 + -fStack_4c4 * (float)local_5e8._4_4_;
      auVar117._4_4_ =
           -(float)local_508._4_4_ * fVar62 +
           -local_4b8._8_4_ * fVar151 + -fStack_4c0 * (float)local_5e8._4_4_;
      auVar117._8_4_ =
           -fStack_500 * fVar62 + -local_4b8._12_4_ * fVar151 + -fStack_4bc * (float)local_5e8._4_4_
      ;
      auVar117._12_4_ = fVar62 * -0.0 + fVar151 * -0.0 + (float)local_5e8._4_4_ * -0.0;
      auVar71 = rcpps(auVar159,auVar117);
      fVar107 = auVar71._0_4_;
      fVar109 = auVar71._4_4_;
      fVar136 = auVar71._8_4_;
      fVar137 = auVar71._12_4_;
      fVar107 = (((float)DAT_01f7ba10 - auVar117._0_4_ * fVar107) * fVar107 + fVar107) *
                -((0.0 - fVar289) * -(float)local_508._0_4_ + auVar159._0_4_);
      fVar109 = ((DAT_01f7ba10._4_4_ - auVar117._4_4_ * fVar109) * fVar109 + fVar109) *
                -((0.0 - fVar290) * -(float)local_508._4_4_ + auVar159._4_4_);
      fVar136 = ((DAT_01f7ba10._8_4_ - auVar117._8_4_ * fVar136) * fVar136 + fVar136) *
                -((0.0 - fVar291) * -fStack_500 + auVar159._8_4_);
      fVar137 = ((DAT_01f7ba10._12_4_ - auVar117._12_4_ * fVar137) * fVar137 + fVar137) * 0.0;
      uVar57 = -(uint)(auVar117._0_4_ < 0.0 || ABS(auVar117._0_4_) < 1e-18);
      uVar58 = -(uint)(auVar117._4_4_ < 0.0 || ABS(auVar117._4_4_) < 1e-18);
      uVar59 = -(uint)(auVar117._8_4_ < 0.0 || ABS(auVar117._8_4_) < 1e-18);
      uVar60 = -(uint)(auVar117._12_4_ < 0.0 || ABS(auVar117._12_4_) < 1e-18);
      auVar248._0_8_ = CONCAT44(uVar58,uVar57) & 0xff800000ff800000;
      auVar248._8_4_ = uVar59 & 0xff800000;
      auVar248._12_4_ = uVar60 & 0xff800000;
      auVar89._0_4_ = ~uVar57 & (uint)fVar107;
      auVar89._4_4_ = ~uVar58 & (uint)fVar109;
      auVar89._8_4_ = ~uVar59 & (uint)fVar136;
      auVar89._12_4_ = ~uVar60 & (uint)fVar137;
      auVar71 = maxps(auVar190,auVar89 | auVar248);
      uVar57 = -(uint)(0.0 < auVar117._0_4_ || ABS(auVar117._0_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar117._4_4_ || ABS(auVar117._4_4_) < 1e-18);
      uVar59 = -(uint)(0.0 < auVar117._8_4_ || ABS(auVar117._8_4_) < 1e-18);
      uVar60 = -(uint)(0.0 < auVar117._12_4_ || ABS(auVar117._12_4_) < 1e-18);
      auVar90._0_8_ = CONCAT44(uVar58,uVar57) & 0x7f8000007f800000;
      auVar90._8_4_ = uVar59 & 0x7f800000;
      auVar90._12_4_ = uVar60 & 0x7f800000;
      auVar118._0_4_ = ~uVar57 & (uint)fVar107;
      auVar118._4_4_ = ~uVar58 & (uint)fVar109;
      auVar118._8_4_ = ~uVar59 & (uint)fVar136;
      auVar118._12_4_ = ~uVar60 & (uint)fVar137;
      local_238 = minps(auVar191,auVar118 | auVar90);
      fVar137 = auVar71._12_4_;
      fVar107 = auVar71._0_4_;
      fVar109 = auVar71._4_4_;
      fVar136 = auVar71._8_4_;
      auVar119._0_4_ = -(uint)(fVar107 <= local_238._0_4_) & auVar179._0_4_;
      auVar119._4_4_ = -(uint)(fVar109 <= local_238._4_4_) & auVar179._4_4_;
      auVar119._8_4_ = -(uint)(fVar136 <= local_238._8_4_) & auVar179._8_4_;
      auVar119._12_4_ = -(uint)(fVar137 <= local_238._12_4_) & auVar179._12_4_;
      iVar41 = movmskps(iVar41,auVar119);
      pauVar46 = (undefined1 (*) [16])CONCAT44(uVar47,iVar41);
      if (iVar41 != 0) {
        auVar190 = maxps(ZEXT816(0),auVar141);
        auVar22._4_4_ = fStack_1f4;
        auVar22._0_4_ = local_1f8;
        auVar22._8_4_ = fStack_1f0;
        auVar22._12_4_ = fStack_1ec;
        auVar191 = minps(auVar22,_DAT_01f7ba10);
        auVar180._0_12_ = ZEXT812(0);
        auVar180._12_4_ = 0.0;
        auVar234 = maxps(auVar191,auVar180);
        auVar23._4_4_ = fStack_1e4;
        auVar23._0_4_ = local_1e8;
        auVar23._8_4_ = fStack_1e0;
        auVar23._12_4_ = fStack_1dc;
        auVar191 = minps(auVar23,_DAT_01f7ba10);
        auVar191 = maxps(auVar191,auVar180);
        auVar11._4_4_ = local_518;
        auVar11._0_4_ = local_518;
        auVar11._8_4_ = local_518;
        auVar11._12_4_ = local_518;
        local_108[0] = (auVar234._0_4_ + 0.0) * 0.25 * local_518 + local_1b8;
        local_108[1] = (auVar234._4_4_ + 1.0) * 0.25 * local_518 + local_1b8;
        local_108[2] = (auVar234._8_4_ + 2.0) * 0.25 * local_518 + local_1b8;
        local_108[3] = (auVar234._12_4_ + 3.0) * 0.25 * local_518 + local_1b8;
        local_118[0] = (auVar191._0_4_ + 0.0) * 0.25 * local_518 + local_1b8;
        local_118[1] = (auVar191._4_4_ + 1.0) * 0.25 * local_518 + local_1b8;
        local_118[2] = (auVar191._8_4_ + 2.0) * 0.25 * local_518 + local_1b8;
        local_118[3] = (auVar191._12_4_ + 3.0) * 0.25 * local_518 + local_1b8;
        auVar145._0_4_ = fVar210 - auVar190._0_4_ * auVar190._0_4_;
        auVar145._4_4_ = fVar212 - auVar190._4_4_ * auVar190._4_4_;
        auVar145._8_4_ = fVar229 - auVar190._8_4_ * auVar190._8_4_;
        auVar145._12_4_ = fVar230 - auVar190._12_4_ * auVar190._12_4_;
        auVar286._0_4_ = local_1a8 * local_1a8 - (float)local_538._0_4_ * auVar145._0_4_;
        auVar286._4_4_ = fStack_1a4 * fStack_1a4 - (float)local_538._4_4_ * auVar145._4_4_;
        auVar286._8_4_ = fStack_1a0 * fStack_1a0 - fStack_530 * auVar145._8_4_;
        auVar286._12_4_ = fStack_19c * fStack_19c - fStack_52c * auVar145._12_4_;
        local_538._4_4_ = -(uint)(0.0 <= auVar286._4_4_);
        local_538._0_4_ = -(uint)(0.0 <= auVar286._0_4_);
        fStack_530 = (float)-(uint)(0.0 <= auVar286._8_4_);
        fStack_52c = (float)-(uint)(0.0 <= auVar286._12_4_);
        iVar41 = movmskps(iVar41,_local_538);
        if (iVar41 == 0) {
          fVar212 = 0.0;
          fVar230 = 0.0;
          fVar238 = 0.0;
          fVar240 = 0.0;
          fVar229 = 0.0;
          fVar231 = 0.0;
          fVar239 = 0.0;
          fVar242 = 0.0;
          fVar198 = 0.0;
          fVar199 = 0.0;
          fVar185 = 0.0;
          fVar210 = 0.0;
          fVar150 = 0.0;
          fVar152 = 0.0;
          fVar172 = 0.0;
          fVar173 = 0.0;
          _local_588 = ZEXT816(0);
          iVar41 = 0;
          auVar207 = _DAT_01f7aa00;
          auVar228 = _DAT_01f7a9f0;
        }
        else {
          auVar191 = sqrtps(auVar11,auVar286);
          auVar91._0_4_ = local_3b8 + local_3b8;
          auVar91._4_4_ = fStack_3b4 + fStack_3b4;
          auVar91._8_4_ = fStack_3b0 + fStack_3b0;
          auVar91._12_4_ = fStack_3ac + fStack_3ac;
          auVar190 = rcpps(auVar145,auVar91);
          fVar253 = auVar190._0_4_;
          fVar254 = auVar190._4_4_;
          fVar255 = auVar190._8_4_;
          fVar263 = auVar190._12_4_;
          fVar253 = ((float)DAT_01f7ba10 - auVar91._0_4_ * fVar253) * fVar253 + fVar253;
          fVar254 = (DAT_01f7ba10._4_4_ - auVar91._4_4_ * fVar254) * fVar254 + fVar254;
          fVar255 = (DAT_01f7ba10._8_4_ - auVar91._8_4_ * fVar255) * fVar255 + fVar255;
          fVar263 = (DAT_01f7ba10._12_4_ - auVar91._12_4_ * fVar263) * fVar263 + fVar263;
          fVar265 = (-local_1a8 - auVar191._0_4_) * fVar253;
          fVar267 = (-fStack_1a4 - auVar191._4_4_) * fVar254;
          fVar269 = (-fStack_1a0 - auVar191._8_4_) * fVar255;
          fVar272 = (-fStack_19c - auVar191._12_4_) * fVar263;
          fVar253 = (auVar191._0_4_ - local_1a8) * fVar253;
          fVar254 = (auVar191._4_4_ - fStack_1a4) * fVar254;
          fVar255 = (auVar191._8_4_ - fStack_1a0) * fVar255;
          fVar263 = (auVar191._12_4_ - fStack_19c) * fVar263;
          fVar212 = (local_188 * fVar265 + fVar231) * fVar108;
          fVar229 = (fStack_184 * fVar267 + fVar238) * fVar135;
          fVar230 = (fStack_180 * fVar269 + fVar239) * auVar279._8_4_;
          fVar242 = (fStack_17c * fVar272 + fVar240) * auVar279._12_4_;
          fVar198 = fVar62 * fVar265 - (local_438 * fVar212 + fVar287);
          fVar199 = fVar62 * fVar267 - (fStack_434 * fVar229 + fVar289);
          fVar185 = fVar62 * fVar269 - (fStack_430 * fVar230 + fVar290);
          fVar210 = fVar62 * fVar272 - (fStack_42c * fVar242 + fVar291);
          fVar150 = fVar151 * fVar265 - ((float)local_418._0_4_ * fVar212 + fVar276);
          fVar152 = fVar151 * fVar267 - ((float)local_418._4_4_ * fVar229 + fVar264);
          fVar172 = fVar151 * fVar269 - (fStack_410 * fVar230 + fVar266);
          fVar173 = fVar151 * fVar272 - (fStack_40c * fVar242 + fVar268);
          local_588._4_4_ =
               (float)local_5e8._4_4_ * fVar267 - (fVar229 * (float)local_428._4_4_ + fVar174);
          local_588._0_4_ =
               (float)local_5e8._4_4_ * fVar265 - (fVar212 * (float)local_428._0_4_ + fVar200);
          fStack_580 = (float)local_5e8._4_4_ * fVar269 - (fVar230 * fStack_420 + fVar186);
          fStack_57c = (float)local_5e8._4_4_ * fVar272 - (fVar242 * fStack_41c + fVar211);
          fVar108 = (local_188 * fVar253 + fVar231) * fVar108;
          fVar135 = (fStack_184 * fVar254 + fVar238) * fVar135;
          fVar243 = (fStack_180 * fVar255 + fVar239) * auVar279._8_4_;
          fVar244 = (fStack_17c * fVar263 + fVar240) * auVar279._12_4_;
          fVar212 = fVar62 * fVar253 - (local_438 * fVar108 + fVar287);
          fVar230 = fVar62 * fVar254 - (fStack_434 * fVar135 + fVar289);
          fVar238 = fVar62 * fVar255 - (fStack_430 * fVar243 + fVar290);
          fVar240 = fVar62 * fVar263 - (fStack_42c * fVar244 + fVar291);
          fVar229 = fVar151 * fVar253 - ((float)local_418._0_4_ * fVar108 + fVar276);
          fVar231 = fVar151 * fVar254 - ((float)local_418._4_4_ * fVar135 + fVar264);
          fVar239 = fVar151 * fVar255 - (fStack_410 * fVar243 + fVar266);
          fVar242 = fVar151 * fVar263 - (fStack_40c * fVar244 + fVar268);
          bVar56 = 0.0 <= auVar286._0_4_;
          uVar57 = -(uint)bVar56;
          bVar8 = 0.0 <= auVar286._4_4_;
          uVar58 = -(uint)bVar8;
          bVar9 = 0.0 <= auVar286._8_4_;
          uVar59 = -(uint)bVar9;
          bVar10 = 0.0 <= auVar286._12_4_;
          uVar60 = -(uint)bVar10;
          auVar180._0_4_ =
               (float)local_5e8._4_4_ * fVar253 - (fVar108 * (float)local_428._0_4_ + fVar200);
          auVar180._4_4_ =
               (float)local_5e8._4_4_ * fVar254 - (fVar135 * (float)local_428._4_4_ + fVar174);
          auVar180._8_4_ = (float)local_5e8._4_4_ * fVar255 - (fVar243 * fStack_420 + fVar186);
          auVar180._12_4_ = (float)local_5e8._4_4_ * fVar263 - (fVar244 * fStack_41c + fVar211);
          auVar206._0_4_ = (uint)fVar265 & uVar57;
          auVar206._4_4_ = (uint)fVar267 & uVar58;
          auVar206._8_4_ = (uint)fVar269 & uVar59;
          auVar206._12_4_ = (uint)fVar272 & uVar60;
          auVar228._0_8_ = CONCAT44(~uVar58,~uVar57) & 0x7f8000007f800000;
          auVar228._8_4_ = ~uVar59 & 0x7f800000;
          auVar228._12_4_ = ~uVar60 & 0x7f800000;
          auVar228 = auVar228 | auVar206;
          auVar193._0_4_ = (uint)fVar253 & uVar57;
          auVar193._4_4_ = (uint)fVar254 & uVar58;
          auVar193._8_4_ = (uint)fVar255 & uVar59;
          auVar193._12_4_ = (uint)fVar263 & uVar60;
          auVar207._0_8_ = CONCAT44(~uVar58,~uVar57) & 0xff800000ff800000;
          auVar207._8_4_ = ~uVar59 & 0xff800000;
          auVar207._12_4_ = ~uVar60 & 0xff800000;
          auVar207 = auVar207 | auVar193;
          auVar92._0_8_ = CONCAT44(fStack_194,local_198) & 0x7fffffff7fffffff;
          auVar92._8_4_ = ABS(fStack_190);
          auVar92._12_4_ = ABS(fStack_18c);
          auVar21._4_4_ = fStack_3a4;
          auVar21._0_4_ = local_3a8;
          auVar21._8_4_ = fStack_3a0;
          auVar21._12_4_ = fStack_39c;
          auVar190 = maxps(auVar21,auVar92);
          fVar108 = auVar190._0_4_ * 1.9073486e-06;
          fVar135 = auVar190._4_4_ * 1.9073486e-06;
          fVar200 = auVar190._8_4_ * 1.9073486e-06;
          fVar174 = auVar190._12_4_ * 1.9073486e-06;
          auVar194._0_4_ = -(uint)(ABS(local_3b8) < fVar108 && bVar56);
          auVar194._4_4_ = -(uint)(ABS(fStack_3b4) < fVar135 && bVar8);
          auVar194._8_4_ = -(uint)(ABS(fStack_3b0) < fVar200 && bVar9);
          auVar194._12_4_ = -(uint)(ABS(fStack_3ac) < fVar174 && bVar10);
          iVar41 = movmskps(iVar41,auVar194);
          if (iVar41 != 0) {
            uVar57 = -(uint)(auVar145._0_4_ <= 0.0);
            uVar58 = -(uint)(auVar145._4_4_ <= 0.0);
            uVar59 = -(uint)(auVar145._8_4_ <= 0.0);
            uVar60 = -(uint)(auVar145._12_4_ <= 0.0);
            auVar251._0_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar194._0_4_;
            auVar251._4_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar194._4_4_;
            auVar251._8_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar194._8_4_;
            auVar251._12_4_ = (uVar60 & 0xff800000 | ~uVar60 & 0x7f800000) & auVar194._12_4_;
            auVar237._0_4_ = ~auVar194._0_4_ & auVar228._0_4_;
            auVar237._4_4_ = ~auVar194._4_4_ & auVar228._4_4_;
            auVar237._8_4_ = ~auVar194._8_4_ & auVar228._8_4_;
            auVar237._12_4_ = ~auVar194._12_4_ & auVar228._12_4_;
            auVar228 = auVar237 | auVar251;
            auVar252._0_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar194._0_4_;
            auVar252._4_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar194._4_4_;
            auVar252._8_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar194._8_4_;
            auVar252._12_4_ = (uVar60 & 0x7f800000 | ~uVar60 & 0xff800000) & auVar194._12_4_;
            auVar197._0_4_ = ~auVar194._0_4_ & auVar207._0_4_;
            auVar197._4_4_ = ~auVar194._4_4_ & auVar207._4_4_;
            auVar197._8_4_ = ~auVar194._8_4_ & auVar207._8_4_;
            auVar197._12_4_ = ~auVar194._12_4_ & auVar207._12_4_;
            auVar207 = auVar197 | auVar252;
            local_538._4_4_ =
                 -(uint)((fVar135 <= ABS(fStack_3b4) || auVar145._4_4_ <= 0.0) && bVar8);
            local_538._0_4_ =
                 -(uint)((fVar108 <= ABS(local_3b8) || auVar145._0_4_ <= 0.0) && bVar56);
            fStack_530 = (float)-(uint)((fVar200 <= ABS(fStack_3b0) || auVar145._8_4_ <= 0.0) &&
                                       bVar9);
            fStack_52c = (float)-(uint)((fVar174 <= ABS(fStack_3ac) || auVar145._12_4_ <= 0.0) &&
                                       bVar10);
          }
        }
        local_528._4_4_ =
             -(uint)(0.3 <= ABS(fVar230 * fVar62 +
                                fVar231 * fVar151 + auVar180._4_4_ * (float)local_5e8._4_4_));
        local_528._0_4_ =
             -(uint)(0.3 <= ABS(fVar212 * fVar62 +
                                fVar229 * fVar151 + auVar180._0_4_ * (float)local_5e8._4_4_));
        fStack_520 = (float)-(uint)(0.3 <= ABS(fVar238 * fVar62 +
                                               fVar239 * fVar151 +
                                               auVar180._8_4_ * (float)local_5e8._4_4_));
        fStack_51c = (float)-(uint)(0.3 <= ABS(fVar240 * fVar62 +
                                               fVar242 * fVar151 +
                                               auVar180._12_4_ * (float)local_5e8._4_4_));
        _local_138 = auVar71;
        local_128 = minps(local_238,auVar228);
        _local_248 = maxps(auVar71,auVar207);
        local_428._0_4_ = -(uint)(fVar107 <= local_128._0_4_) & auVar119._0_4_;
        local_428._4_4_ = -(uint)(fVar109 <= local_128._4_4_) & auVar119._4_4_;
        fStack_420 = (float)(-(uint)(fVar136 <= local_128._8_4_) & auVar119._8_4_);
        fStack_41c = (float)(-(uint)(fVar137 <= local_128._12_4_) & auVar119._12_4_);
        fVar108 = local_248._0_4_;
        fVar135 = local_248._4_4_;
        fVar200 = local_248._8_4_;
        fVar174 = local_248._12_4_;
        local_418 = (undefined1  [8])
                    CONCAT44(-(uint)(fVar135 <= local_238._4_4_) & auVar119._4_4_,
                             -(uint)(fVar108 <= local_238._0_4_) & auVar119._0_4_);
        fStack_410 = (float)(-(uint)(fVar200 <= local_238._8_4_) & auVar119._8_4_);
        fStack_40c = (float)(-(uint)(fVar174 <= local_238._12_4_) & auVar119._12_4_);
        auVar120._8_4_ = fStack_410;
        auVar120._0_8_ = local_418;
        auVar120._12_4_ = fStack_40c;
        iVar41 = movmskps(iVar41,auVar120 | _local_428);
        pauVar46 = (undefined1 (*) [16])CONCAT44(uVar47,iVar41);
        if (iVar41 != 0) {
          local_438 = (float)iVar53;
          fStack_434 = (float)iVar53;
          fStack_430 = (float)iVar53;
          fStack_42c = (float)iVar53;
          local_588._0_4_ =
               -(uint)(iVar53 < ((int)((-(uint)(0.3 <= ABS((float)local_588._0_4_ *
                                                           (float)local_5e8._4_4_ +
                                                           fVar150 * fVar151 + fVar198 * fVar62)) &
                                       local_538._0_4_) << 0x1f) >> 0x1f) + 4);
          local_588._4_4_ =
               -(uint)(iVar53 < ((int)((-(uint)(0.3 <= ABS((float)local_588._4_4_ *
                                                           (float)local_5e8._4_4_ +
                                                           fVar152 * fVar151 + fVar199 * fVar62)) &
                                       local_538._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_580 = (float)-(uint)(iVar53 < ((int)((-(uint)(0.3 <= ABS(fStack_580 *
                                                                          (float)local_5e8._4_4_ +
                                                                          fVar172 * fVar151 +
                                                                          fVar185 * fVar62)) &
                                                      (uint)fStack_530) << 0x1f) >> 0x1f) + 4);
          fStack_57c = (float)-(uint)(iVar53 < ((int)((-(uint)(0.3 <= ABS(fStack_57c *
                                                                          (float)local_5e8._4_4_ +
                                                                          fVar173 * fVar151 +
                                                                          fVar210 * fVar62)) &
                                                      (uint)fStack_52c) << 0x1f) >> 0x1f) + 4);
          local_3e8 = ~_local_588 & _local_428;
          iVar41 = movmskps(iVar41,local_3e8);
          fVar150 = fVar108;
          fVar152 = fVar135;
          fVar172 = fVar200;
          fVar173 = fVar174;
          if (iVar41 != 0) {
            local_518 = fVar106 + fVar107;
            fStack_514 = fVar106 + fVar109;
            fStack_510 = fVar106 + fVar136;
            fStack_50c = fVar106 + fVar137;
            do {
              auVar191 = ~local_3e8 & _DAT_01f7a9f0 | local_3e8 & auVar71;
              auVar160._4_4_ = auVar191._0_4_;
              auVar160._0_4_ = auVar191._4_4_;
              auVar160._8_4_ = auVar191._12_4_;
              auVar160._12_4_ = auVar191._8_4_;
              auVar190 = minps(auVar160,auVar191);
              auVar121._0_8_ = auVar190._8_8_;
              auVar121._8_4_ = auVar190._0_4_;
              auVar121._12_4_ = auVar190._4_4_;
              auVar190 = minps(auVar121,auVar190);
              auVar122._0_8_ =
                   CONCAT44(-(uint)(auVar190._4_4_ == auVar191._4_4_) & local_3e8._4_4_,
                            -(uint)(auVar190._0_4_ == auVar191._0_4_) & local_3e8._0_4_);
              auVar122._8_4_ = -(uint)(auVar190._8_4_ == auVar191._8_4_) & local_3e8._8_4_;
              auVar122._12_4_ = -(uint)(auVar190._12_4_ == auVar191._12_4_) & local_3e8._12_4_;
              iVar41 = movmskps(iVar41,auVar122);
              auVar93 = local_3e8;
              if (iVar41 != 0) {
                auVar93._8_4_ = auVar122._8_4_;
                auVar93._0_8_ = auVar122._0_8_;
                auVar93._12_4_ = auVar122._12_4_;
              }
              uVar42 = movmskps(iVar41,auVar93);
              lVar49 = 0;
              if (CONCAT44(uVar47,uVar42) != 0) {
                for (; (CONCAT44(uVar47,uVar42) >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
                }
              }
              *(undefined4 *)(local_3e8 + lVar49 * 4) = 0;
              auVar18._4_4_ = fStack_444;
              auVar18._0_4_ = local_448;
              auVar18._8_4_ = fStack_440;
              auVar18._12_4_ = fStack_43c;
              auVar16._4_4_ = fStack_454;
              auVar16._0_4_ = local_458;
              auVar16._8_4_ = fStack_450;
              auVar16._12_4_ = fStack_44c;
              auVar191 = minps(auVar18,auVar16);
              auVar234 = maxps(auVar18,auVar16);
              auVar14._4_4_ = fStack_464;
              auVar14._0_4_ = local_468;
              auVar14._8_4_ = fStack_460;
              auVar14._12_4_ = fStack_45c;
              auVar12._4_4_ = fStack_474;
              auVar12._0_4_ = local_478;
              auVar12._8_4_ = fStack_470;
              auVar12._12_4_ = fStack_46c;
              auVar190 = minps(auVar14,auVar12);
              auVar191 = minps(auVar191,auVar190);
              auVar190 = maxps(auVar14,auVar12);
              auVar234 = maxps(auVar234,auVar190);
              auVar161._0_8_ = auVar191._0_8_ & 0x7fffffff7fffffff;
              auVar161._8_4_ = auVar191._8_4_ & 0x7fffffff;
              auVar161._12_4_ = auVar191._12_4_ & 0x7fffffff;
              auVar94._0_8_ = auVar234._0_8_ & 0x7fffffff7fffffff;
              auVar94._8_4_ = auVar234._8_4_ & 0x7fffffff;
              auVar94._12_4_ = ABS(auVar234._12_4_);
              auVar190 = maxps(auVar161,auVar94);
              fVar107 = auVar190._4_4_;
              if (auVar190._4_4_ <= auVar190._0_4_) {
                fVar107 = auVar190._0_4_;
              }
              auVar162._8_8_ = auVar190._8_8_;
              auVar162._0_8_ = auVar190._8_8_;
              if (auVar190._8_4_ <= fVar107) {
                auVar162._0_4_ = fVar107;
              }
              fVar136 = auVar162._0_4_ * 1.9073486e-06;
              fVar107 = local_108[lVar49];
              fVar109 = *(float *)(local_138 + lVar49 * 4);
              bVar56 = true;
              uVar48 = 0;
              do {
                fVar152 = SQRT(fVar105) * 1.9073486e-06 * fVar109;
                fVar230 = 1.0 - fVar107;
                fVar137 = fVar230 * fVar230 * fVar230;
                fVar187 = fVar107 * fVar107 * fVar107;
                fVar173 = fVar107 * fVar230;
                fVar150 = fVar137 * 0.16666667;
                fVar185 = (fVar230 * fVar173 * 12.0 + fVar107 * fVar173 * 6.0 +
                          fVar137 * 4.0 + fVar187) * 0.16666667;
                fVar186 = (fVar107 * fVar173 * 12.0 + fVar230 * fVar173 * 6.0 +
                          fVar187 * 4.0 + fVar137) * 0.16666667;
                fVar187 = fVar187 * 0.16666667;
                fVar172 = fVar150 * fStack_43c +
                          fVar185 * fStack_44c + fVar186 * fStack_45c + fVar187 * fStack_46c;
                fVar199 = -fVar230 * fVar230 * 0.5;
                fVar198 = (-fVar107 * fVar107 - fVar173 * 4.0) * 0.5;
                fVar173 = (fVar173 * 4.0 + fVar230 * fVar230) * 0.5;
                fVar137 = fVar107 * fVar107 * 0.5;
                fVar210 = fVar199 * local_448 +
                          fVar198 * local_458 + fVar173 * local_468 + fVar137 * local_478;
                fVar211 = fVar199 * fStack_444 +
                          fVar198 * fStack_454 + fVar173 * fStack_464 + fVar137 * fStack_474;
                fVar212 = fVar199 * fStack_440 +
                          fVar198 * fStack_450 + fVar173 * fStack_460 + fVar137 * fStack_470;
                fVar229 = fVar199 * fStack_43c +
                          fVar198 * fStack_44c + fVar173 * fStack_45c + fVar137 * fStack_46c;
                fVar137 = fVar107 - (fVar230 + fVar230);
                fVar173 = fVar230 - (fVar107 + fVar107);
                fVar231 = fVar230 * local_448 +
                          fVar137 * local_458 + fVar173 * local_468 + local_478 * fVar107;
                fVar238 = fVar230 * fStack_444 +
                          fVar137 * fStack_454 + fVar173 * fStack_464 + fStack_474 * fVar107;
                fVar230 = fVar230 * fStack_440 +
                          fVar137 * fStack_450 + fVar173 * fStack_460 + fStack_470 * fVar107;
                fVar198 = (fVar109 * (float)local_578._0_4_ + 0.0) -
                          (fVar150 * local_448 +
                          fVar185 * local_458 + fVar186 * local_468 + fVar187 * local_478);
                fVar199 = (fVar109 * (float)local_578._4_4_ + 0.0) -
                          (fVar150 * fStack_444 +
                          fVar185 * fStack_454 + fVar186 * fStack_464 + fVar187 * fStack_474);
                fVar185 = (fVar109 * fStack_570 + 0.0) -
                          (fVar150 * fStack_440 +
                          fVar185 * fStack_450 + fVar186 * fStack_460 + fVar187 * fStack_470);
                fVar150 = (fVar109 * fStack_56c + 0.0) - fVar172;
                fVar137 = fVar199 * fVar199;
                fVar173 = fVar185 * fVar185;
                fVar187 = fVar150 * fVar150;
                auVar249._0_4_ = fVar137 + fVar198 * fVar198 + fVar173;
                auVar249._4_4_ = fVar137 + fVar137 + fVar187;
                auVar249._8_4_ = fVar137 + fVar173 + fVar173;
                auVar249._12_4_ = fVar137 + fVar187 + fVar187;
                fStack_5d4 = auVar162._4_4_;
                fStack_5d0 = auVar162._8_4_;
                fStack_5cc = auVar162._12_4_;
                fVar137 = fVar136;
                if (fVar136 <= fVar152) {
                  fVar137 = fVar152;
                }
                fVar187 = fVar211 * fVar211 + fVar210 * fVar210 + fVar212 * fVar212;
                auVar190 = ZEXT416((uint)fVar187);
                auVar191 = rsqrtss(ZEXT416((uint)fVar187),auVar190);
                fVar152 = auVar191._0_4_;
                fVar186 = fVar152 * 1.5 - fVar152 * fVar152 * fVar187 * 0.5 * fVar152;
                fVar243 = fVar210 * fVar186;
                fVar244 = fVar211 * fVar186;
                fVar253 = fVar212 * fVar186;
                fVar254 = fVar229 * fVar186;
                fVar255 = fVar230 * fVar212 + fVar238 * fVar211 + fVar231 * fVar210;
                auVar190 = rcpss(auVar190,auVar190);
                fVar152 = (2.0 - fVar187 * auVar190._0_4_) * auVar190._0_4_;
                fVar173 = fVar199 * fVar244;
                fVar239 = fVar185 * fVar253;
                fVar240 = fVar150 * fVar254;
                fVar263 = fVar173 + fVar198 * fVar243 + fVar239;
                fVar265 = fVar173 + fVar173 + fVar240;
                fVar239 = fVar173 + fVar239 + fVar239;
                fVar240 = fVar173 + fVar240 + fVar240;
                fVar242 = (SQRT(auVar249._0_4_) + 1.0) * (fVar136 / SQRT(fVar187)) +
                          SQRT(auVar249._0_4_) * fVar136 + fVar137;
                fVar173 = fStack_56c * fVar254;
                fVar254 = fVar254 * -fVar229;
                fVar231 = fVar253 * -fVar212 + fVar244 * -fVar211 + fVar243 * -fVar210 +
                          fVar152 * (fVar187 * fVar230 - fVar255 * fVar212) * fVar186 * fVar185 +
                          fVar152 * (fVar187 * fVar238 - fVar255 * fVar211) * fVar186 * fVar199 +
                          fVar152 * (fVar187 * fVar231 - fVar255 * fVar210) * fVar186 * fVar198;
                fVar152 = fStack_570 * fVar253 +
                          (float)local_578._4_4_ * fVar244 + (float)local_578._0_4_ * fVar243;
                fVar186 = auVar249._0_4_ - fVar263 * fVar263;
                auVar95._0_8_ = CONCAT44(auVar249._4_4_ - fVar265 * fVar265,fVar186);
                auVar95._8_4_ = auVar249._8_4_ - fVar239 * fVar239;
                auVar95._12_4_ = auVar249._12_4_ - fVar240 * fVar240;
                fVar238 = -fVar229 * fVar150;
                local_5c8 = CONCAT44(fVar254,fVar231);
                fVar150 = fStack_56c * fVar150;
                fVar187 = (fStack_570 * fVar185 +
                          (float)local_578._4_4_ * fVar199 + (float)local_578._0_4_ * fVar198) -
                          fVar263 * fVar152;
                auVar123._8_4_ = auVar95._8_4_;
                auVar123._0_8_ = auVar95._0_8_;
                auVar123._12_4_ = auVar95._12_4_;
                auVar190 = rsqrtss(auVar123,auVar95);
                fVar230 = auVar190._0_4_;
                auVar163._0_4_ = fVar230 * 1.5 - fVar230 * fVar230 * fVar186 * 0.5 * fVar230;
                auVar163._4_12_ = auVar190._4_12_;
                if (fVar186 < 0.0) {
                  fStack_4c4 = fStack_5d4;
                  fStack_4c0 = fStack_5d0;
                  fStack_4bc = fStack_5cc;
                  local_4d8._4_4_ = fVar265;
                  local_4d8._0_4_ = fVar263;
                  fStack_4d0 = fVar239;
                  fStack_4cc = fVar240;
                  _local_508 = auVar163;
                  local_4f8 = fVar187;
                  fStack_4f4 = fVar150;
                  fStack_4f0 = fStack_570 * fVar185;
                  fStack_4ec = fVar150;
                  local_4e8 = fVar152;
                  fStack_4e4 = fVar173;
                  fStack_4e0 = fStack_570 * fVar253;
                  fStack_4dc = fVar173;
                  local_4c8 = fVar137;
                  local_4b8 = auVar249;
                  fVar186 = sqrtf(fVar186);
                  auVar163 = _local_508;
                  auVar249 = local_4b8;
                  fVar137 = local_4c8;
                  fVar152 = local_4e8;
                  fVar173 = fStack_4e4;
                  fVar187 = local_4f8;
                  fVar150 = fStack_4f4;
                  fVar230 = (float)local_4d8._0_4_;
                }
                else {
                  fVar186 = SQRT(fVar186);
                  fVar230 = fVar263;
                }
                fVar186 = fVar186 - fVar172;
                fVar172 = ((-fVar212 * fVar185 + -fVar211 * fVar199 + -fVar210 * fVar198) -
                          fVar263 * fVar231) * auVar163._0_4_ - fVar229;
                fVar187 = fVar187 * auVar163._0_4_;
                auVar182._0_8_ = CONCAT44(fVar238,fVar172) ^ 0x8000000080000000;
                auVar164._0_4_ = fVar231 * fVar187 - fVar152 * fVar172;
                auVar182._8_4_ = -fVar238;
                auVar182._12_4_ = fVar150;
                auVar181._8_8_ = auVar182._8_8_;
                auVar181._0_8_ = CONCAT44(fVar187,fVar172) ^ 0x80000000;
                auVar164._4_4_ = auVar164._0_4_;
                auVar164._8_4_ = auVar164._0_4_;
                auVar164._12_4_ = auVar164._0_4_;
                auVar190 = divps(auVar181,auVar164);
                auVar209._8_4_ = fVar254;
                auVar209._0_8_ = local_5c8;
                auVar209._12_4_ = -fVar173;
                auVar208._8_8_ = auVar209._8_8_;
                auVar208._0_8_ = CONCAT44(fVar152,fVar231) ^ 0x8000000000000000;
                auVar191 = divps(auVar208,auVar164);
                fVar109 = fVar109 - (fVar186 * auVar191._0_4_ + fVar230 * auVar190._0_4_);
                fVar107 = fVar107 - (fVar186 * auVar191._4_4_ + fVar230 * auVar190._4_4_);
                if ((ABS(fVar230) < fVar242) &&
                   (ABS(fVar186) < auVar234._12_4_ * 1.9073486e-06 + fVar137 + fVar242)) {
                  fVar109 = (float)local_408._0_4_ + fVar109;
                  if ((fVar63 <= fVar109) &&
                     (fVar136 = *(float *)(ray + k * 4 + 0x80), fVar109 <= fVar136)) {
                    uVar43 = 0;
                    if ((fVar107 < 0.0) || (1.0 < fVar107)) goto LAB_00a44e1f;
                    auVar190 = rsqrtss(auVar249,auVar249);
                    fVar137 = auVar190._0_4_;
                    pGVar6 = (context->scene->geometries).items[local_480].ptr;
                    if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (uVar43 = CONCAT71((int7)((ulong)context->args >> 8),1),
                         pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar137 = fVar137 * 1.5 +
                                  fVar137 * fVar137 * auVar249._0_4_ * -0.5 * fVar137;
                        fVar198 = fVar198 * fVar137;
                        fVar199 = fVar199 * fVar137;
                        fVar185 = fVar185 * fVar137;
                        fVar137 = fVar229 * fVar198 + fVar210;
                        fVar150 = fVar229 * fVar199 + fVar211;
                        fVar152 = fVar229 * fVar185 + fVar212;
                        fVar172 = fVar199 * fVar210 - fVar211 * fVar198;
                        fVar173 = fVar185 * fVar211 - fVar212 * fVar199;
                        fVar187 = fVar198 * fVar212 - fVar210 * fVar185;
                        local_2b8 = fVar173 * fVar150 - fVar187 * fVar137;
                        local_2d8._4_4_ = fVar187 * fVar152 - fVar172 * fVar150;
                        local_2c8 = fVar172 * fVar137 - fVar173 * fVar152;
                        local_2d8._0_4_ = local_2d8._4_4_;
                        fStack_2d0 = (float)local_2d8._4_4_;
                        fStack_2cc = (float)local_2d8._4_4_;
                        fStack_2c4 = local_2c8;
                        fStack_2c0 = local_2c8;
                        fStack_2bc = local_2c8;
                        fStack_2b4 = local_2b8;
                        fStack_2b0 = local_2b8;
                        fStack_2ac = local_2b8;
                        local_2a8 = fVar107;
                        fStack_2a4 = fVar107;
                        fStack_2a0 = fVar107;
                        fStack_29c = fVar107;
                        local_298 = 0;
                        uStack_294 = 0;
                        uStack_290 = 0;
                        uStack_28c = 0;
                        local_288 = CONCAT44(iStack_3d4,local_3d8);
                        uStack_280 = CONCAT44(iStack_3cc,iStack_3d0);
                        local_278 = CONCAT44(uStack_3c4,local_3c8);
                        uStack_270 = CONCAT44(uStack_3bc,uStack_3c0);
                        local_268 = context->user->instID[0];
                        uStack_264 = local_268;
                        uStack_260 = local_268;
                        uStack_25c = local_268;
                        local_258 = context->user->instPrimID[0];
                        uStack_254 = local_258;
                        uStack_250 = local_258;
                        uStack_24c = local_258;
                        *(float *)(ray + k * 4 + 0x80) = fVar109;
                        local_598 = *local_4a0;
                        _local_568 = (int *)local_598;
                        uStack_560 = pGVar6->userPtr;
                        local_558 = context->user;
                        local_550 = ray;
                        local_548 = (RTCHitN *)local_2d8;
                        local_540 = 4;
                        p_Var45 = pGVar6->occlusionFilterN;
                        if (p_Var45 != (RTCFilterFunctionN)0x0) {
                          p_Var45 = (RTCFilterFunctionN)
                                    (*p_Var45)((RTCFilterFunctionNArguments *)local_568);
                        }
                        auVar124._0_4_ = -(uint)(local_598._0_4_ == 0);
                        auVar124._4_4_ = -(uint)(local_598._4_4_ == 0);
                        auVar124._8_4_ = -(uint)(local_598._8_4_ == 0);
                        auVar124._12_4_ = -(uint)(local_598._12_4_ == 0);
                        uVar57 = movmskps((int)p_Var45,auVar124);
                        pRVar44 = (RayK<4> *)(ulong)(uVar57 ^ 0xf);
                        if ((uVar57 ^ 0xf) == 0) {
                          auVar124 = auVar124 ^ _DAT_01f7ae20;
                        }
                        else {
                          p_Var45 = context->args->filter;
                          if ((p_Var45 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var45)((RTCFilterFunctionNArguments *)local_568);
                          }
                          auVar96._0_4_ = -(uint)(local_598._0_4_ == 0);
                          auVar96._4_4_ = -(uint)(local_598._4_4_ == 0);
                          auVar96._8_4_ = -(uint)(local_598._8_4_ == 0);
                          auVar96._12_4_ = -(uint)(local_598._12_4_ == 0);
                          auVar124 = auVar96 ^ _DAT_01f7ae20;
                          *(undefined1 (*) [16])(local_550 + 0x80) =
                               ~auVar96 & _DAT_01f7aa00 |
                               *(undefined1 (*) [16])(local_550 + 0x80) & auVar96;
                          pRVar44 = local_550;
                        }
                        auVar125._0_4_ = auVar124._0_4_ << 0x1f;
                        auVar125._4_4_ = auVar124._4_4_ << 0x1f;
                        auVar125._8_4_ = auVar124._8_4_ << 0x1f;
                        auVar125._12_4_ = auVar124._12_4_ << 0x1f;
                        iVar41 = movmskps((int)pRVar44,auVar125);
                        uVar43 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar44 >> 0x20),iVar41) >> 8
                                                ),iVar41 != 0);
                        if (iVar41 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar136;
                        }
                      }
                      goto LAB_00a44e1f;
                    }
                  }
                  uVar43 = 0;
                  goto LAB_00a44e1f;
                }
                bVar56 = uVar48 < 4;
                uVar48 = uVar48 + 1;
              } while (uVar48 != 5);
              bVar56 = false;
              uVar43 = 5;
LAB_00a44e1f:
              fVar187 = *(float *)(ray + k * 4 + 0x80);
              local_3e8._0_4_ = -(uint)(local_518 <= fVar187) & local_3e8._0_4_;
              local_3e8._4_4_ = -(uint)(fStack_514 <= fVar187) & local_3e8._4_4_;
              local_3e8._8_4_ = -(uint)(fStack_510 <= fVar187) & local_3e8._8_4_;
              local_3e8._12_4_ = -(uint)(fStack_50c <= fVar187) & local_3e8._12_4_;
              bVar52 = (bool)(bVar52 | bVar56 & (byte)uVar43);
              uVar47 = (undefined4)((ulong)uVar43 >> 0x20);
              iVar41 = movmskps((int)uVar43,local_3e8);
            } while (iVar41 != 0);
            pPVar54 = local_498;
            prim = local_490;
            fVar150 = (float)local_248._0_4_;
            fVar152 = (float)local_248._4_4_;
            fVar172 = fStack_240;
            fVar173 = fStack_23c;
          }
          auVar126._0_4_ = -(uint)(fVar108 + fVar106 <= fVar187) & local_418._0_4_;
          auVar126._4_4_ = -(uint)(fVar135 + fVar106 <= fVar187) & local_418._4_4_;
          auVar126._8_4_ = -(uint)(fVar200 + fVar106 <= fVar187) & (uint)fStack_410;
          auVar126._12_4_ = -(uint)(fVar174 + fVar106 <= fVar187) & (uint)fStack_40c;
          local_528._0_4_ =
               -(uint)((int)local_438 <
                      ((int)((local_528._0_4_ & local_538._0_4_) << 0x1f) >> 0x1f) + 4);
          local_528._4_4_ =
               -(uint)((int)fStack_434 <
                      ((int)((local_528._4_4_ & local_538._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_520 = (float)-(uint)((int)fStack_430 <
                                     ((int)(((uint)fStack_520 & (uint)fStack_530) << 0x1f) >> 0x1f)
                                     + 4);
          fStack_51c = (float)-(uint)((int)fStack_42c <
                                     ((int)(((uint)fStack_51c & (uint)fStack_52c) << 0x1f) >> 0x1f)
                                     + 4);
          local_3f8 = ~_local_528 & auVar126;
          iVar41 = movmskps(0,local_3f8);
          if (iVar41 != 0) {
            local_518 = fVar106 + fVar150;
            fStack_514 = fVar106 + fVar152;
            fStack_510 = fVar106 + fVar172;
            fStack_50c = fVar106 + fVar173;
            do {
              uVar57 = local_3f8._0_4_;
              uVar58 = local_3f8._4_4_;
              uVar59 = local_3f8._8_4_;
              uVar60 = local_3f8._12_4_;
              auVar127._0_4_ = uVar57 & (uint)fVar150;
              auVar127._4_4_ = uVar58 & (uint)fVar152;
              auVar127._8_4_ = uVar59 & (uint)fVar172;
              auVar127._12_4_ = uVar60 & (uint)fVar173;
              auVar146._0_8_ = CONCAT44(~uVar58,~uVar57) & 0x7f8000007f800000;
              auVar146._8_4_ = ~uVar59 & 0x7f800000;
              auVar146._12_4_ = ~uVar60 & 0x7f800000;
              auVar146 = auVar146 | auVar127;
              auVar165._4_4_ = auVar146._0_4_;
              auVar165._0_4_ = auVar146._4_4_;
              auVar165._8_4_ = auVar146._12_4_;
              auVar165._12_4_ = auVar146._8_4_;
              auVar71 = minps(auVar165,auVar146);
              auVar128._0_8_ = auVar71._8_8_;
              auVar128._8_4_ = auVar71._0_4_;
              auVar128._12_4_ = auVar71._4_4_;
              auVar71 = minps(auVar128,auVar71);
              auVar129._0_8_ =
                   CONCAT44(-(uint)(auVar71._4_4_ == auVar146._4_4_) & uVar58,
                            -(uint)(auVar71._0_4_ == auVar146._0_4_) & uVar57);
              auVar129._8_4_ = -(uint)(auVar71._8_4_ == auVar146._8_4_) & uVar59;
              auVar129._12_4_ = -(uint)(auVar71._12_4_ == auVar146._12_4_) & uVar60;
              iVar41 = movmskps(iVar41,auVar129);
              auVar97 = local_3f8;
              if (iVar41 != 0) {
                auVar97._8_4_ = auVar129._8_4_;
                auVar97._0_8_ = auVar129._0_8_;
                auVar97._12_4_ = auVar129._12_4_;
              }
              uVar42 = movmskps(iVar41,auVar97);
              lVar49 = 0;
              if (CONCAT44(uVar47,uVar42) != 0) {
                for (; (CONCAT44(uVar47,uVar42) >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
                }
              }
              *(undefined4 *)(local_3f8 + lVar49 * 4) = 0;
              auVar19._4_4_ = fStack_444;
              auVar19._0_4_ = local_448;
              auVar19._8_4_ = fStack_440;
              auVar19._12_4_ = fStack_43c;
              auVar17._4_4_ = fStack_454;
              auVar17._0_4_ = local_458;
              auVar17._8_4_ = fStack_450;
              auVar17._12_4_ = fStack_44c;
              auVar190 = minps(auVar19,auVar17);
              auVar191 = maxps(auVar19,auVar17);
              auVar15._4_4_ = fStack_464;
              auVar15._0_4_ = local_468;
              auVar15._8_4_ = fStack_460;
              auVar15._12_4_ = fStack_45c;
              auVar13._4_4_ = fStack_474;
              auVar13._0_4_ = local_478;
              auVar13._8_4_ = fStack_470;
              auVar13._12_4_ = fStack_46c;
              auVar71 = minps(auVar15,auVar13);
              auVar190 = minps(auVar190,auVar71);
              auVar71 = maxps(auVar15,auVar13);
              auVar191 = maxps(auVar191,auVar71);
              auVar166._0_8_ = auVar190._0_8_ & 0x7fffffff7fffffff;
              auVar166._8_4_ = auVar190._8_4_ & 0x7fffffff;
              auVar166._12_4_ = auVar190._12_4_ & 0x7fffffff;
              auVar98._0_8_ = auVar191._0_8_ & 0x7fffffff7fffffff;
              auVar98._8_4_ = auVar191._8_4_ & 0x7fffffff;
              auVar98._12_4_ = ABS(auVar191._12_4_);
              auVar71 = maxps(auVar166,auVar98);
              fVar107 = auVar71._4_4_;
              if (auVar71._4_4_ <= auVar71._0_4_) {
                fVar107 = auVar71._0_4_;
              }
              auVar167._8_8_ = auVar71._8_8_;
              auVar167._0_8_ = auVar71._8_8_;
              if (auVar71._8_4_ <= fVar107) {
                auVar167._0_4_ = fVar107;
              }
              fVar109 = auVar167._0_4_ * 1.9073486e-06;
              fVar107 = local_118[lVar49];
              fVar108 = *(float *)(local_238 + lVar49 * 4);
              bVar56 = true;
              uVar48 = 0;
              do {
                fVar137 = SQRT(fVar105) * 1.9073486e-06 * fVar108;
                fVar230 = 1.0 - fVar107;
                fVar135 = fVar230 * fVar230 * fVar230;
                fVar199 = fVar107 * fVar107 * fVar107;
                fVar198 = fVar107 * fVar230;
                fVar136 = fVar135 * 0.16666667;
                fVar185 = (fVar230 * fVar198 * 12.0 + fVar107 * fVar198 * 6.0 +
                          fVar135 * 4.0 + fVar199) * 0.16666667;
                fVar186 = (fVar107 * fVar198 * 12.0 + fVar230 * fVar198 * 6.0 +
                          fVar199 * 4.0 + fVar135) * 0.16666667;
                fVar199 = fVar199 * 0.16666667;
                fVar187 = fVar136 * fStack_43c +
                          fVar185 * fStack_44c + fVar186 * fStack_45c + fVar199 * fStack_46c;
                fVar174 = -fVar230 * fVar230 * 0.5;
                fVar200 = (-fVar107 * fVar107 - fVar198 * 4.0) * 0.5;
                fVar198 = (fVar198 * 4.0 + fVar230 * fVar230) * 0.5;
                fVar135 = fVar107 * fVar107 * 0.5;
                fVar210 = fVar174 * local_448 +
                          fVar200 * local_458 + fVar198 * local_468 + fVar135 * local_478;
                fVar211 = fVar174 * fStack_444 +
                          fVar200 * fStack_454 + fVar198 * fStack_464 + fVar135 * fStack_474;
                fVar212 = fVar174 * fStack_440 +
                          fVar200 * fStack_450 + fVar198 * fStack_460 + fVar135 * fStack_470;
                fVar229 = fVar174 * fStack_43c +
                          fVar200 * fStack_44c + fVar198 * fStack_45c + fVar135 * fStack_46c;
                fVar135 = fVar107 - (fVar230 + fVar230);
                fVar198 = fVar230 - (fVar107 + fVar107);
                fVar231 = fVar230 * local_448 +
                          fVar135 * local_458 + fVar198 * local_468 + local_478 * fVar107;
                fVar238 = fVar230 * fStack_444 +
                          fVar135 * fStack_454 + fVar198 * fStack_464 + fStack_474 * fVar107;
                fVar230 = fVar230 * fStack_440 +
                          fVar135 * fStack_450 + fVar198 * fStack_460 + fStack_470 * fVar107;
                fVar200 = (fVar108 * (float)local_578._0_4_ + 0.0) -
                          (fVar136 * local_448 +
                          fVar185 * local_458 + fVar186 * local_468 + fVar199 * local_478);
                fVar174 = (fVar108 * (float)local_578._4_4_ + 0.0) -
                          (fVar136 * fStack_444 +
                          fVar185 * fStack_454 + fVar186 * fStack_464 + fVar199 * fStack_474);
                fVar185 = (fVar108 * fStack_570 + 0.0) -
                          (fVar136 * fStack_440 +
                          fVar185 * fStack_450 + fVar186 * fStack_460 + fVar199 * fStack_470);
                fVar136 = (fVar108 * fStack_56c + 0.0) - fVar187;
                fVar135 = fVar174 * fVar174;
                fVar198 = fVar185 * fVar185;
                fVar199 = fVar136 * fVar136;
                auVar250._0_4_ = fVar135 + fVar200 * fVar200 + fVar198;
                auVar250._4_4_ = fVar135 + fVar135 + fVar199;
                auVar250._8_4_ = fVar135 + fVar198 + fVar198;
                auVar250._12_4_ = fVar135 + fVar199 + fVar199;
                fStack_5d4 = auVar167._4_4_;
                fStack_5d0 = auVar167._8_4_;
                fStack_5cc = auVar167._12_4_;
                fVar135 = fVar109;
                if (fVar109 <= fVar137) {
                  fVar135 = fVar137;
                }
                fVar198 = fVar211 * fVar211 + fVar210 * fVar210 + fVar212 * fVar212;
                auVar71 = ZEXT416((uint)fVar198);
                auVar190 = rsqrtss(ZEXT416((uint)fVar198),auVar71);
                fVar137 = auVar190._0_4_;
                fVar186 = fVar137 * 1.5 - fVar137 * fVar137 * fVar198 * 0.5 * fVar137;
                fVar243 = fVar210 * fVar186;
                fVar244 = fVar211 * fVar186;
                fVar253 = fVar212 * fVar186;
                fVar254 = fVar229 * fVar186;
                fVar255 = fVar230 * fVar212 + fVar238 * fVar211 + fVar231 * fVar210;
                auVar71 = rcpss(auVar71,auVar71);
                fVar137 = (2.0 - fVar198 * auVar71._0_4_) * auVar71._0_4_;
                fVar199 = fVar174 * fVar244;
                fVar239 = fVar185 * fVar253;
                fVar240 = fVar136 * fVar254;
                fVar263 = fVar199 + fVar200 * fVar243 + fVar239;
                fVar265 = fVar199 + fVar199 + fVar240;
                fVar239 = fVar199 + fVar239 + fVar239;
                fVar240 = fVar199 + fVar240 + fVar240;
                fVar242 = (SQRT(auVar250._0_4_) + 1.0) * (fVar109 / SQRT(fVar198)) +
                          SQRT(auVar250._0_4_) * fVar109 + fVar135;
                fVar199 = fStack_56c * fVar254;
                fVar254 = fVar254 * -fVar229;
                fVar231 = fVar253 * -fVar212 + fVar244 * -fVar211 + fVar243 * -fVar210 +
                          fVar137 * (fVar198 * fVar230 - fVar255 * fVar212) * fVar186 * fVar185 +
                          fVar137 * (fVar198 * fVar238 - fVar255 * fVar211) * fVar186 * fVar174 +
                          fVar137 * (fVar198 * fVar231 - fVar255 * fVar210) * fVar186 * fVar200;
                fVar198 = fStack_570 * fVar253 +
                          (float)local_578._4_4_ * fVar244 + (float)local_578._0_4_ * fVar243;
                fVar186 = auVar250._0_4_ - fVar263 * fVar263;
                auVar99._0_8_ = CONCAT44(auVar250._4_4_ - fVar265 * fVar265,fVar186);
                auVar99._8_4_ = auVar250._8_4_ - fVar239 * fVar239;
                auVar99._12_4_ = auVar250._12_4_ - fVar240 * fVar240;
                fVar238 = -fVar229 * fVar136;
                local_5c8 = CONCAT44(fVar254,fVar231);
                fVar136 = fStack_56c * fVar136;
                fVar137 = (fStack_570 * fVar185 +
                          (float)local_578._4_4_ * fVar174 + (float)local_578._0_4_ * fVar200) -
                          fVar263 * fVar198;
                auVar130._8_4_ = auVar99._8_4_;
                auVar130._0_8_ = auVar99._0_8_;
                auVar130._12_4_ = auVar99._12_4_;
                auVar71 = rsqrtss(auVar130,auVar99);
                fVar230 = auVar71._0_4_;
                auVar168._0_4_ = fVar230 * 1.5 - fVar230 * fVar230 * fVar186 * 0.5 * fVar230;
                auVar168._4_12_ = auVar71._4_12_;
                if (fVar186 < 0.0) {
                  fStack_4c4 = fStack_5d4;
                  fStack_4c0 = fStack_5d0;
                  fStack_4bc = fStack_5cc;
                  local_4d8._4_4_ = fVar265;
                  local_4d8._0_4_ = fVar263;
                  fStack_4d0 = fVar239;
                  fStack_4cc = fVar240;
                  _local_508 = auVar168;
                  local_4f8 = fVar137;
                  fStack_4f4 = fVar136;
                  fStack_4f0 = fStack_570 * fVar185;
                  fStack_4ec = fVar136;
                  local_4e8 = fVar198;
                  fStack_4e4 = fVar199;
                  fStack_4e0 = fStack_570 * fVar253;
                  fStack_4dc = fVar199;
                  local_4c8 = fVar135;
                  local_4b8 = auVar250;
                  fVar186 = sqrtf(fVar186);
                  auVar168 = _local_508;
                  auVar250 = local_4b8;
                  fVar135 = local_4c8;
                  fVar137 = local_4f8;
                  fVar136 = fStack_4f4;
                  fVar198 = local_4e8;
                  fVar199 = fStack_4e4;
                  fVar230 = (float)local_4d8._0_4_;
                }
                else {
                  fVar186 = SQRT(fVar186);
                  fVar230 = fVar263;
                }
                fVar186 = fVar186 - fVar187;
                fVar187 = ((-fVar212 * fVar185 + -fVar211 * fVar174 + -fVar210 * fVar200) -
                          fVar263 * fVar231) * auVar168._0_4_ - fVar229;
                fVar137 = fVar137 * auVar168._0_4_;
                auVar184._0_8_ = CONCAT44(fVar238,fVar187) ^ 0x8000000080000000;
                auVar169._0_4_ = fVar231 * fVar137 - fVar198 * fVar187;
                auVar184._8_4_ = -fVar238;
                auVar184._12_4_ = fVar136;
                auVar183._8_8_ = auVar184._8_8_;
                auVar183._0_8_ = CONCAT44(fVar137,fVar187) ^ 0x80000000;
                auVar169._4_4_ = auVar169._0_4_;
                auVar169._8_4_ = auVar169._0_4_;
                auVar169._12_4_ = auVar169._0_4_;
                auVar71 = divps(auVar183,auVar169);
                auVar196._8_4_ = fVar254;
                auVar196._0_8_ = local_5c8;
                auVar196._12_4_ = -fVar199;
                auVar195._8_8_ = auVar196._8_8_;
                auVar195._0_8_ = CONCAT44(fVar198,fVar231) ^ 0x8000000000000000;
                auVar190 = divps(auVar195,auVar169);
                fVar108 = fVar108 - (fVar186 * auVar190._0_4_ + fVar230 * auVar71._0_4_);
                fVar107 = fVar107 - (fVar186 * auVar190._4_4_ + fVar230 * auVar71._4_4_);
                if ((ABS(fVar230) < fVar242) &&
                   (ABS(fVar186) < auVar191._12_4_ * 1.9073486e-06 + fVar135 + fVar242)) {
                  fVar108 = (float)local_408._0_4_ + fVar108;
                  if (fVar108 < fVar63) {
                    uVar43 = 0;
                    goto LAB_00a458cb;
                  }
                  fVar109 = *(float *)(ray + k * 4 + 0x80);
                  if (fVar108 <= fVar109) {
                    uVar43 = 0;
                    if ((fVar107 < 0.0) || (1.0 < fVar107)) goto LAB_00a458cb;
                    auVar71 = rsqrtss(auVar250,auVar250);
                    fVar135 = auVar71._0_4_;
                    pGVar6 = (context->scene->geometries).items[local_480].ptr;
                    if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (uVar43 = CONCAT71((int7)((ulong)context->args >> 8),1),
                         pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar135 = fVar135 * 1.5 +
                                  fVar135 * fVar135 * auVar250._0_4_ * -0.5 * fVar135;
                        fVar200 = fVar200 * fVar135;
                        fVar174 = fVar174 * fVar135;
                        fVar185 = fVar185 * fVar135;
                        fVar135 = fVar229 * fVar200 + fVar210;
                        fVar136 = fVar229 * fVar174 + fVar211;
                        fVar137 = fVar229 * fVar185 + fVar212;
                        fVar187 = fVar174 * fVar210 - fVar211 * fVar200;
                        fVar198 = fVar185 * fVar211 - fVar212 * fVar174;
                        fVar199 = fVar200 * fVar212 - fVar210 * fVar185;
                        local_2b8 = fVar198 * fVar136 - fVar199 * fVar135;
                        local_2d8._4_4_ = fVar199 * fVar137 - fVar187 * fVar136;
                        local_2c8 = fVar187 * fVar135 - fVar198 * fVar137;
                        local_2d8._0_4_ = local_2d8._4_4_;
                        fStack_2d0 = (float)local_2d8._4_4_;
                        fStack_2cc = (float)local_2d8._4_4_;
                        fStack_2c4 = local_2c8;
                        fStack_2c0 = local_2c8;
                        fStack_2bc = local_2c8;
                        fStack_2b4 = local_2b8;
                        fStack_2b0 = local_2b8;
                        fStack_2ac = local_2b8;
                        local_2a8 = fVar107;
                        fStack_2a4 = fVar107;
                        fStack_2a0 = fVar107;
                        fStack_29c = fVar107;
                        local_298 = 0;
                        uStack_294 = 0;
                        uStack_290 = 0;
                        uStack_28c = 0;
                        local_288 = CONCAT44(iStack_3d4,local_3d8);
                        uStack_280 = CONCAT44(iStack_3cc,iStack_3d0);
                        local_278 = CONCAT44(uStack_3c4,local_3c8);
                        uStack_270 = CONCAT44(uStack_3bc,uStack_3c0);
                        local_268 = context->user->instID[0];
                        uStack_264 = local_268;
                        uStack_260 = local_268;
                        uStack_25c = local_268;
                        local_258 = context->user->instPrimID[0];
                        uStack_254 = local_258;
                        uStack_250 = local_258;
                        uStack_24c = local_258;
                        *(float *)(ray + k * 4 + 0x80) = fVar108;
                        local_598 = *local_4a0;
                        _local_568 = (int *)local_598;
                        uStack_560 = pGVar6->userPtr;
                        local_558 = context->user;
                        local_550 = ray;
                        local_548 = (RTCHitN *)local_2d8;
                        local_540 = 4;
                        p_Var45 = pGVar6->occlusionFilterN;
                        if (p_Var45 != (RTCFilterFunctionN)0x0) {
                          p_Var45 = (RTCFilterFunctionN)
                                    (*p_Var45)((RTCFilterFunctionNArguments *)local_568);
                        }
                        auVar131._0_4_ = -(uint)(local_598._0_4_ == 0);
                        auVar131._4_4_ = -(uint)(local_598._4_4_ == 0);
                        auVar131._8_4_ = -(uint)(local_598._8_4_ == 0);
                        auVar131._12_4_ = -(uint)(local_598._12_4_ == 0);
                        uVar57 = movmskps((int)p_Var45,auVar131);
                        pRVar44 = (RayK<4> *)(ulong)(uVar57 ^ 0xf);
                        if ((uVar57 ^ 0xf) == 0) {
                          auVar131 = auVar131 ^ _DAT_01f7ae20;
                        }
                        else {
                          p_Var45 = context->args->filter;
                          if ((p_Var45 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var45)((RTCFilterFunctionNArguments *)local_568);
                          }
                          auVar100._0_4_ = -(uint)(local_598._0_4_ == 0);
                          auVar100._4_4_ = -(uint)(local_598._4_4_ == 0);
                          auVar100._8_4_ = -(uint)(local_598._8_4_ == 0);
                          auVar100._12_4_ = -(uint)(local_598._12_4_ == 0);
                          auVar131 = auVar100 ^ _DAT_01f7ae20;
                          *(undefined1 (*) [16])(local_550 + 0x80) =
                               ~auVar100 & _DAT_01f7aa00 |
                               *(undefined1 (*) [16])(local_550 + 0x80) & auVar100;
                          pRVar44 = local_550;
                        }
                        auVar132._0_4_ = auVar131._0_4_ << 0x1f;
                        auVar132._4_4_ = auVar131._4_4_ << 0x1f;
                        auVar132._8_4_ = auVar131._8_4_ << 0x1f;
                        auVar132._12_4_ = auVar131._12_4_ << 0x1f;
                        iVar41 = movmskps((int)pRVar44,auVar132);
                        uVar43 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar44 >> 0x20),iVar41) >> 8
                                                ),iVar41 != 0);
                        if (iVar41 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar109;
                        }
                      }
                      goto LAB_00a458cb;
                    }
                  }
                  uVar43 = 0;
                  goto LAB_00a458cb;
                }
                bVar56 = uVar48 < 4;
                uVar48 = uVar48 + 1;
              } while (uVar48 != 5);
              bVar56 = false;
              uVar43 = 5;
LAB_00a458cb:
              fVar187 = *(float *)(ray + k * 4 + 0x80);
              local_3f8._0_4_ = -(uint)(local_518 <= fVar187) & local_3f8._0_4_;
              local_3f8._4_4_ = -(uint)(fStack_514 <= fVar187) & local_3f8._4_4_;
              local_3f8._8_4_ = -(uint)(fStack_510 <= fVar187) & local_3f8._8_4_;
              local_3f8._12_4_ = -(uint)(fStack_50c <= fVar187) & local_3f8._12_4_;
              bVar52 = (bool)(bVar52 | bVar56 & (byte)uVar43);
              uVar47 = (undefined4)((ulong)uVar43 >> 0x20);
              iVar41 = movmskps((int)uVar43,local_3f8);
            } while (iVar41 != 0);
            iVar41 = 0;
            pPVar54 = local_498;
            prim = local_490;
            fVar150 = (float)local_248._0_4_;
            fVar152 = (float)local_248._4_4_;
            fVar172 = fStack_240;
            fVar173 = fStack_23c;
          }
          auVar170._0_4_ =
               local_588._0_4_ & local_428._0_4_ &
               -(uint)(fVar106 + (float)local_138._0_4_ <= fVar187);
          auVar170._4_4_ =
               local_588._4_4_ & local_428._4_4_ &
               -(uint)(fVar106 + (float)local_138._4_4_ <= fVar187);
          auVar170._8_4_ =
               (uint)fStack_580 & (uint)fStack_420 & -(uint)(fVar106 + fStack_130 <= fVar187);
          auVar170._12_4_ =
               (uint)fStack_57c & (uint)fStack_41c & -(uint)(fVar106 + fStack_12c <= fVar187);
          auVar147._0_4_ = local_528._0_4_ & auVar126._0_4_ & -(uint)(fVar106 + fVar150 <= fVar187);
          auVar147._4_4_ = local_528._4_4_ & auVar126._4_4_ & -(uint)(fVar106 + fVar152 <= fVar187);
          auVar147._8_4_ = (uint)fStack_520 & auVar126._8_4_ & -(uint)(fVar106 + fVar172 <= fVar187)
          ;
          auVar147._12_4_ =
               (uint)fStack_51c & auVar126._12_4_ & -(uint)(fVar106 + fVar173 <= fVar187);
          uVar57 = movmskps(iVar41,auVar147 | auVar170);
          pauVar46 = (undefined1 (*) [16])(ulong)uVar57;
          if (uVar57 != 0) {
            pauVar46 = (undefined1 (*) [16])(uVar50 * 0x30);
            *(undefined1 (*) [16])(auStack_f8 + (long)pauVar46) = auVar147 | auVar170;
            auStack_e8[uVar50 * 0xc] =
                 ~auVar170._0_4_ & (uint)fVar150 | local_138._0_4_ & auVar170._0_4_;
            *(uint *)(&stack0x0000000c + (long)pauVar46[-0xf]) =
                 ~auVar170._4_4_ & (uint)fVar152 | local_138._4_4_ & auVar170._4_4_;
            *(uint *)(&stack0x00000000 + (long)pauVar46[-0xe]) =
                 ~auVar170._8_4_ & (uint)fVar172 | (uint)fStack_130 & auVar170._8_4_;
            *(uint *)(&stack0x00000004 + (long)pauVar46[-0xe]) =
                 ~auVar170._12_4_ & (uint)fVar173 | (uint)fStack_12c & auVar170._12_4_;
            (&uStack_d8)[uVar50 * 6] = CONCAT44(fStack_1b4,local_1b8);
            aiStack_d0[uVar50 * 0xc] = iVar53 + 1;
            iVar51 = iVar51 + 1;
          }
        }
      }
    }
    if (iVar51 == 0) break;
    fVar107 = *(float *)(ray + k * 4 + 0x80);
    uVar58 = -iVar51;
    pauVar46 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar51 - 1) * 0x30);
    uVar57 = uVar58;
    while( true ) {
      auVar133._0_4_ = -(uint)(fVar106 + *(float *)pauVar46[1] <= fVar107) & *(uint *)*pauVar46;
      auVar133._4_4_ =
           -(uint)(fVar106 + *(float *)(pauVar46[1] + 4) <= fVar107) & *(uint *)(*pauVar46 + 4);
      auVar133._8_4_ =
           -(uint)(fVar106 + *(float *)(pauVar46[1] + 8) <= fVar107) & *(uint *)(*pauVar46 + 8);
      auVar133._12_4_ =
           -(uint)(fVar106 + *(float *)(pauVar46[1] + 0xc) <= fVar107) & *(uint *)(*pauVar46 + 0xc);
      _local_2d8 = auVar133;
      iVar41 = movmskps(uVar58,auVar133);
      if (iVar41 != 0) break;
      pauVar46 = pauVar46 + -3;
      uVar57 = uVar57 + 1;
      uVar58 = 0;
      if (uVar57 == 0) goto LAB_00a45e46;
    }
    auVar148._0_4_ = (uint)*(float *)pauVar46[1] & auVar133._0_4_;
    auVar148._4_4_ = (uint)*(float *)(pauVar46[1] + 4) & auVar133._4_4_;
    auVar148._8_4_ = (uint)*(float *)(pauVar46[1] + 8) & auVar133._8_4_;
    auVar148._12_4_ = (uint)*(float *)(pauVar46[1] + 0xc) & auVar133._12_4_;
    auVar171._0_8_ = CONCAT44(~auVar133._4_4_,~auVar133._0_4_) & 0x7f8000007f800000;
    auVar171._8_4_ = ~auVar133._8_4_ & 0x7f800000;
    auVar171._12_4_ = ~auVar133._12_4_ & 0x7f800000;
    auVar171 = auVar171 | auVar148;
    auVar149._4_4_ = auVar171._0_4_;
    auVar149._0_4_ = auVar171._4_4_;
    auVar149._8_4_ = auVar171._12_4_;
    auVar149._12_4_ = auVar171._8_4_;
    auVar71 = minps(auVar149,auVar171);
    auVar101._0_8_ = auVar71._8_8_;
    auVar101._8_4_ = auVar71._0_4_;
    auVar101._12_4_ = auVar71._4_4_;
    auVar71 = minps(auVar101,auVar71);
    auVar102._0_8_ =
         CONCAT44(-(uint)(auVar71._4_4_ == auVar171._4_4_) & auVar133._4_4_,
                  -(uint)(auVar71._0_4_ == auVar171._0_4_) & auVar133._0_4_);
    auVar102._8_4_ = -(uint)(auVar71._8_4_ == auVar171._8_4_) & auVar133._8_4_;
    auVar102._12_4_ = -(uint)(auVar71._12_4_ == auVar171._12_4_) & auVar133._12_4_;
    iVar41 = movmskps(iVar41,auVar102);
    if (iVar41 != 0) {
      auVar133._8_4_ = auVar102._8_4_;
      auVar133._0_8_ = auVar102._0_8_;
      auVar133._12_4_ = auVar102._12_4_;
    }
    uVar43 = *(undefined8 *)pauVar46[2];
    iVar53 = *(int *)(pauVar46[2] + 8);
    uVar58 = movmskps(iVar41,auVar133);
    lVar49 = 0;
    if (uVar58 != 0) {
      for (; (uVar58 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
      }
    }
    *(undefined4 *)(local_2d8 + lVar49 * 4) = 0;
    *pauVar46 = _local_2d8;
    uVar47 = (undefined4)((ulong)pauVar46 >> 0x20);
    iVar41 = movmskps((int)pauVar46,_local_2d8);
    uVar58 = ~uVar57;
    if (iVar41 != 0) {
      uVar58 = -uVar57;
    }
    uVar50 = (ulong)uVar58;
    fVar107 = (float)uVar43;
    fVar108 = (float)((ulong)uVar43 >> 0x20) - fVar107;
    _local_568 = (int *)CONCAT44(fVar108 * 0.33333334 + fVar107,fVar108 * 0.0 + fVar107);
    uStack_560 = (void *)CONCAT44(fVar108 * 1.0 + fVar107,fVar108 * 0.6666667 + fVar107);
    local_1b8 = *(float *)(local_568 + lVar49 * 4);
    fStack_1b4 = *(float *)(local_568 + lVar49 * 4 + 4);
  } while( true );
LAB_00a45e46:
  if (bVar52 != false) {
    return bVar52;
  }
  fVar151 = *(float *)(ray + k * 4 + 0x80);
  auVar134._4_4_ = -(uint)(fStack_224 <= fVar151);
  auVar134._0_4_ = -(uint)(local_228 <= fVar151);
  auVar134._8_4_ = -(uint)(fStack_220 <= fVar151);
  auVar134._12_4_ = -(uint)(fStack_21c <= fVar151);
  uVar57 = movmskps((int)pauVar46,auVar134);
  uVar57 = (uint)local_488 & uVar57;
  if (uVar57 == 0) {
    return false;
  }
  goto LAB_00a43546;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }